

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  bool bVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  uint uVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  long lVar55;
  byte bVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  float fVar60;
  vint4 bi_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 uVar61;
  undefined1 auVar69 [16];
  float fVar62;
  undefined1 auVar73 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar97;
  vint4 bi_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar96 [12];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar98;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 extraout_var [56];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  vint4 ai_2;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vint4 ai;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar154;
  float fVar155;
  vint4 bi;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar156;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [32];
  float fVar160;
  undefined8 uVar161;
  float fVar182;
  vfloat4 b0_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar180;
  float fVar183;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar181;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  vint4 ai_1;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  vfloat4 a0_2;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  vfloat4 a0_3;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  float fVar248;
  float fVar261;
  float fVar262;
  vfloat4 a0_1;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar263;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  vfloat4 a0;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar282 [16];
  undefined1 auVar286 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_760 [16];
  float local_700;
  float fStack_6fc;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar54;
  undefined1 auVar95 [64];
  undefined1 auVar120 [32];
  
  PVar3 = prim[1];
  uVar59 = (ulong)(byte)PVar3;
  fVar60 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar130._0_4_ = fVar60 * auVar9._0_4_;
  auVar130._4_4_ = fVar60 * auVar9._4_4_;
  auVar130._8_4_ = fVar60 * auVar9._8_4_;
  auVar130._12_4_ = fVar60 * auVar9._12_4_;
  auVar140._0_4_ = fVar60 * auVar10._0_4_;
  auVar140._4_4_ = fVar60 * auVar10._4_4_;
  auVar140._8_4_ = fVar60 * auVar10._8_4_;
  auVar140._12_4_ = fVar60 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar277 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar277 = vcvtdq2ps_avx(auVar277);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar59 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar53 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + uVar59 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  uVar53 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar273._4_4_ = auVar140._0_4_;
  auVar273._0_4_ = auVar140._0_4_;
  auVar273._8_4_ = auVar140._0_4_;
  auVar273._12_4_ = auVar140._0_4_;
  auVar75 = vshufps_avx(auVar140,auVar140,0x55);
  auVar207 = vshufps_avx(auVar140,auVar140,0xaa);
  fVar60 = auVar207._0_4_;
  auVar240._0_4_ = fVar60 * auVar277._0_4_;
  fVar139 = auVar207._4_4_;
  auVar240._4_4_ = fVar139 * auVar277._4_4_;
  fVar154 = auVar207._8_4_;
  auVar240._8_4_ = fVar154 * auVar277._8_4_;
  fVar155 = auVar207._12_4_;
  auVar240._12_4_ = fVar155 * auVar277._12_4_;
  auVar229._0_4_ = auVar12._0_4_ * fVar60;
  auVar229._4_4_ = auVar12._4_4_ * fVar139;
  auVar229._8_4_ = auVar12._8_4_ * fVar154;
  auVar229._12_4_ = auVar12._12_4_ * fVar155;
  auVar200._0_4_ = auVar99._0_4_ * fVar60;
  auVar200._4_4_ = auVar99._4_4_ * fVar139;
  auVar200._8_4_ = auVar99._8_4_ * fVar154;
  auVar200._12_4_ = auVar99._12_4_ * fVar155;
  auVar207 = vfmadd231ps_fma(auVar240,auVar75,auVar10);
  auVar76 = vfmadd231ps_fma(auVar229,auVar75,auVar11);
  auVar75 = vfmadd231ps_fma(auVar200,auVar63,auVar75);
  auVar111 = vfmadd231ps_fma(auVar207,auVar273,auVar9);
  auVar76 = vfmadd231ps_fma(auVar76,auVar273,auVar78);
  auVar66 = vfmadd231ps_fma(auVar75,auVar64,auVar273);
  auVar274._4_4_ = auVar130._0_4_;
  auVar274._0_4_ = auVar130._0_4_;
  auVar274._8_4_ = auVar130._0_4_;
  auVar274._12_4_ = auVar130._0_4_;
  auVar75 = vshufps_avx(auVar130,auVar130,0x55);
  auVar207 = vshufps_avx(auVar130,auVar130,0xaa);
  fVar60 = auVar207._0_4_;
  auVar141._0_4_ = fVar60 * auVar277._0_4_;
  fVar139 = auVar207._4_4_;
  auVar141._4_4_ = fVar139 * auVar277._4_4_;
  fVar154 = auVar207._8_4_;
  auVar141._8_4_ = fVar154 * auVar277._8_4_;
  fVar155 = auVar207._12_4_;
  auVar141._12_4_ = fVar155 * auVar277._12_4_;
  auVar74._0_4_ = auVar12._0_4_ * fVar60;
  auVar74._4_4_ = auVar12._4_4_ * fVar139;
  auVar74._8_4_ = auVar12._8_4_ * fVar154;
  auVar74._12_4_ = auVar12._12_4_ * fVar155;
  auVar207._0_4_ = auVar99._0_4_ * fVar60;
  auVar207._4_4_ = auVar99._4_4_ * fVar139;
  auVar207._8_4_ = auVar99._8_4_ * fVar154;
  auVar207._12_4_ = auVar99._12_4_ * fVar155;
  auVar10 = vfmadd231ps_fma(auVar141,auVar75,auVar10);
  auVar277 = vfmadd231ps_fma(auVar74,auVar75,auVar11);
  auVar11 = vfmadd231ps_fma(auVar207,auVar75,auVar63);
  auVar12 = vfmadd231ps_fma(auVar10,auVar274,auVar9);
  auVar63 = vfmadd231ps_fma(auVar277,auVar274,auVar78);
  auVar99 = vfmadd231ps_fma(auVar11,auVar274,auVar64);
  auVar282._8_4_ = 0x7fffffff;
  auVar282._0_8_ = 0x7fffffff7fffffff;
  auVar282._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar111,auVar282);
  auVar123._8_4_ = 0x219392ef;
  auVar123._0_8_ = 0x219392ef219392ef;
  auVar123._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar123,1);
  auVar10 = vblendvps_avx(auVar111,auVar123,auVar9);
  auVar9 = vandps_avx(auVar76,auVar282);
  auVar9 = vcmpps_avx(auVar9,auVar123,1);
  auVar277 = vblendvps_avx(auVar76,auVar123,auVar9);
  auVar9 = vandps_avx(auVar66,auVar282);
  auVar9 = vcmpps_avx(auVar9,auVar123,1);
  auVar9 = vblendvps_avx(auVar66,auVar123,auVar9);
  auVar78 = vrcpps_avx(auVar10);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = &DAT_3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar78,auVar187);
  auVar78 = vfmadd132ps_fma(auVar10,auVar78,auVar78);
  auVar10 = vrcpps_avx(auVar277);
  auVar277 = vfnmadd213ps_fma(auVar277,auVar10,auVar187);
  auVar11 = vfmadd132ps_fma(auVar277,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar187);
  auVar64 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar12);
  auVar66._0_4_ = auVar78._0_4_ * auVar9._0_4_;
  auVar66._4_4_ = auVar78._4_4_ * auVar9._4_4_;
  auVar66._8_4_ = auVar78._8_4_ * auVar9._8_4_;
  auVar66._12_4_ = auVar78._12_4_ * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar12);
  auVar142._0_4_ = auVar78._0_4_ * auVar9._0_4_;
  auVar142._4_4_ = auVar78._4_4_ * auVar9._4_4_;
  auVar142._8_4_ = auVar78._8_4_ * auVar9._8_4_;
  auVar142._12_4_ = auVar78._12_4_ * auVar9._12_4_;
  auVar76._1_3_ = 0;
  auVar76[0] = PVar3;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar277);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar59 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar78);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar63);
  auVar201._0_4_ = auVar9._0_4_ * auVar11._0_4_;
  auVar201._4_4_ = auVar9._4_4_ * auVar11._4_4_;
  auVar201._8_4_ = auVar9._8_4_ * auVar11._8_4_;
  auVar201._12_4_ = auVar9._12_4_ * auVar11._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar10);
  auVar9 = vsubps_avx(auVar9,auVar63);
  auVar75._0_4_ = auVar11._0_4_ * auVar9._0_4_;
  auVar75._4_4_ = auVar11._4_4_ * auVar9._4_4_;
  auVar75._8_4_ = auVar11._8_4_ * auVar9._8_4_;
  auVar75._12_4_ = auVar11._12_4_ * auVar9._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar53 + uVar59 + 6);
  auVar9 = vpmovsxwd_avx(auVar11);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar99);
  auVar111._0_4_ = auVar64._0_4_ * auVar9._0_4_;
  auVar111._4_4_ = auVar64._4_4_ * auVar9._4_4_;
  auVar111._8_4_ = auVar64._8_4_ * auVar9._8_4_;
  auVar111._12_4_ = auVar64._12_4_ * auVar9._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar99);
  auVar63._0_4_ = auVar64._0_4_ * auVar9._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar9._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar9._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar66,auVar142);
  auVar10 = vpminsd_avx(auVar201,auVar75);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar111,auVar63);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar218._4_4_ = uVar61;
  auVar218._0_4_ = uVar61;
  auVar218._8_4_ = uVar61;
  auVar218._12_4_ = uVar61;
  auVar10 = vmaxps_avx(auVar10,auVar218);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_4a0._0_4_ = auVar9._0_4_ * 0.99999964;
  local_4a0._4_4_ = auVar9._4_4_ * 0.99999964;
  local_4a0._8_4_ = auVar9._8_4_ * 0.99999964;
  local_4a0._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar66,auVar142);
  auVar10 = vpmaxsd_avx(auVar201,auVar75);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar111,auVar63);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar99._4_4_ = uVar61;
  auVar99._0_4_ = uVar61;
  auVar99._8_4_ = uVar61;
  auVar99._12_4_ = uVar61;
  auVar10 = vminps_avx(auVar10,auVar99);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar64._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar76[4] = PVar3;
  auVar76._5_3_ = 0;
  auVar76[8] = PVar3;
  auVar76._9_3_ = 0;
  auVar76[0xc] = PVar3;
  auVar76._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar76,_DAT_01ff0cf0);
  auVar9 = vcmpps_avx(local_4a0,auVar64,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar49 = vmovmskps_avx(auVar9);
  if (uVar49 == 0) {
    return;
  }
  uVar49 = uVar49 & 0xff;
  auVar71._16_16_ = mm_lookupmask_ps._240_16_;
  auVar71._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar71,ZEXT832(0) << 0x20,0x80);
  iVar50 = 1 << ((uint)k & 0x1f);
  auVar72._4_4_ = iVar50;
  auVar72._0_4_ = iVar50;
  auVar72._8_4_ = iVar50;
  auVar72._12_4_ = iVar50;
  auVar72._16_4_ = iVar50;
  auVar72._20_4_ = iVar50;
  auVar72._24_4_ = iVar50;
  auVar72._28_4_ = iVar50;
  auVar14 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar71 = vpand_avx2(auVar72,auVar14);
  local_360 = vpcmpeqd_avx2(auVar71,auVar14);
LAB_016d98bc:
  lVar55 = 0;
  uVar59 = (ulong)uVar49;
  for (uVar53 = uVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar55 = lVar55 + 1;
  }
  uVar49 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar55 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar49].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var8 + uVar53 * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar53 + 1) * (long)pvVar7);
  auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar53 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar53 + 3));
  fVar60 = *pfVar1;
  fVar139 = pfVar1[1];
  fVar154 = pfVar1[2];
  fVar155 = pfVar1[3];
  lVar55 = *(long *)&pGVar5[1].time_range.upper;
  auVar277 = *(undefined1 (*) [16])(lVar55 + (long)p_Var6 * uVar53);
  auVar78 = *(undefined1 (*) [16])(lVar55 + (long)p_Var6 * (uVar53 + 1));
  auVar11 = *(undefined1 (*) [16])(lVar55 + (long)p_Var6 * (uVar53 + 2));
  uVar59 = uVar59 - 1 & uVar59;
  pfVar1 = (float *)(lVar55 + (long)p_Var6 * (uVar53 + 3));
  fVar156 = *pfVar1;
  fVar97 = pfVar1[1];
  fVar98 = pfVar1[2];
  fVar62 = pfVar1[3];
  if (uVar59 != 0) {
    uVar58 = uVar59 - 1 & uVar59;
    for (uVar53 = uVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar65._8_4_ = 0x80000000;
  auVar65._0_8_ = 0x8000000080000000;
  auVar65._12_4_ = 0x80000000;
  auVar124._0_4_ = fVar156 * -0.0;
  auVar124._4_4_ = fVar97 * -0.0;
  auVar124._8_4_ = fVar98 * -0.0;
  auVar124._12_4_ = fVar62 * -0.0;
  auVar63 = vfmadd213ps_fma((undefined1  [16])0x0,auVar11,auVar124);
  auVar77._0_4_ = auVar78._0_4_ + auVar63._0_4_;
  auVar77._4_4_ = auVar78._4_4_ + auVar63._4_4_;
  auVar77._8_4_ = auVar78._8_4_ + auVar63._8_4_;
  auVar77._12_4_ = auVar78._12_4_ + auVar63._12_4_;
  auVar99 = vfmadd231ps_fma(auVar77,auVar277,auVar65);
  auVar207 = ZEXT816(0) << 0x20;
  auVar100._0_4_ = fVar156 * 0.0;
  auVar100._4_4_ = fVar97 * 0.0;
  auVar100._8_4_ = fVar98 * 0.0;
  auVar100._12_4_ = fVar62 * 0.0;
  auVar202._8_4_ = 0x3f000000;
  auVar202._0_8_ = 0x3f0000003f000000;
  auVar202._12_4_ = 0x3f000000;
  auVar63 = vfmadd231ps_fma(auVar100,auVar11,auVar202);
  auVar63 = vfmadd231ps_fma(auVar63,auVar78,auVar207);
  auVar76 = vfnmadd231ps_fma(auVar63,auVar277,auVar202);
  auVar275._0_4_ = fVar60 * -0.0;
  auVar275._4_4_ = fVar139 * -0.0;
  auVar275._8_4_ = fVar154 * -0.0;
  auVar275._12_4_ = fVar155 * -0.0;
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar10,auVar275);
  auVar264._0_4_ = auVar63._0_4_ + auVar9._0_4_;
  auVar264._4_4_ = auVar63._4_4_ + auVar9._4_4_;
  auVar264._8_4_ = auVar63._8_4_ + auVar9._8_4_;
  auVar264._12_4_ = auVar63._12_4_ + auVar9._12_4_;
  auVar249._8_4_ = 0x80000000;
  auVar249._0_8_ = 0x8000000080000000;
  auVar249._12_4_ = 0x80000000;
  auVar63 = vfmadd231ps_fma(auVar264,auVar12,auVar249);
  auVar250._0_4_ = fVar60 * 0.0;
  auVar250._4_4_ = fVar139 * 0.0;
  auVar250._8_4_ = fVar154 * 0.0;
  auVar250._12_4_ = fVar155 * 0.0;
  auVar75 = vfmadd231ps_fma(auVar250,auVar10,auVar202);
  auVar75 = vfmadd231ps_fma(auVar75,auVar9,auVar207);
  auVar111 = vfnmadd231ps_fma(auVar75,auVar12,auVar202);
  auVar125._0_4_ = auVar11._0_4_ + auVar124._0_4_;
  auVar125._4_4_ = auVar11._4_4_ + auVar124._4_4_;
  auVar125._8_4_ = auVar11._8_4_ + auVar124._8_4_;
  auVar125._12_4_ = auVar11._12_4_ + auVar124._12_4_;
  auVar75 = vfmadd231ps_fma(auVar125,auVar78,auVar207);
  auVar126._8_4_ = 0x80000000;
  auVar126._0_8_ = 0x8000000080000000;
  auVar126._12_4_ = 0x80000000;
  auVar75 = vfmadd231ps_fma(auVar75,auVar277,auVar126);
  auVar127._0_4_ = fVar156 * 0.5;
  auVar127._4_4_ = fVar97 * 0.5;
  auVar127._8_4_ = fVar98 * 0.5;
  auVar127._12_4_ = fVar62 * 0.5;
  auVar66 = ZEXT816(0) << 0x20;
  auVar11 = vfmadd231ps_fma(auVar127,auVar66,auVar11);
  auVar78 = vfnmadd231ps_fma(auVar11,auVar202,auVar78);
  auVar207 = vfmadd231ps_fma(auVar78,auVar66,auVar277);
  auVar219._0_4_ = auVar275._0_4_ + auVar10._0_4_;
  auVar219._4_4_ = auVar275._4_4_ + auVar10._4_4_;
  auVar219._8_4_ = auVar275._8_4_ + auVar10._8_4_;
  auVar219._12_4_ = auVar275._12_4_ + auVar10._12_4_;
  auVar277 = vfmadd231ps_fma(auVar219,auVar9,auVar66);
  auVar78 = ZEXT816(0) << 0x20;
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar11 = vfmadd231ps_fma(auVar277,auVar12,auVar67);
  auVar230._0_4_ = fVar60 * 0.5;
  auVar230._4_4_ = fVar139 * 0.5;
  auVar230._8_4_ = fVar154 * 0.5;
  auVar230._12_4_ = fVar155 * 0.5;
  auVar10 = vfmadd231ps_fma(auVar230,auVar78,auVar10);
  auVar9 = vfnmadd231ps_fma(auVar10,auVar202,auVar9);
  auVar12 = vfmadd231ps_fma(auVar9,auVar78,auVar12);
  auVar9 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
  fVar156 = auVar76._0_4_;
  auVar162._0_4_ = fVar156 * auVar10._0_4_;
  fVar97 = auVar76._4_4_;
  auVar162._4_4_ = fVar97 * auVar10._4_4_;
  fVar98 = auVar76._8_4_;
  auVar162._8_4_ = fVar98 * auVar10._8_4_;
  fVar62 = auVar76._12_4_;
  auVar162._12_4_ = fVar62 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar162,auVar9,auVar63);
  auVar277 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar163._0_4_ = fVar156 * auVar10._0_4_;
  auVar163._4_4_ = fVar97 * auVar10._4_4_;
  auVar163._8_4_ = fVar98 * auVar10._8_4_;
  auVar163._12_4_ = fVar62 * auVar10._12_4_;
  auVar9 = vfmsub231ps_fma(auVar163,auVar9,auVar111);
  auVar78 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar207,auVar207,0xc9);
  auVar10 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar181 = auVar207._0_4_;
  auVar143._0_4_ = fVar181 * auVar10._0_4_;
  fVar157 = auVar207._4_4_;
  auVar143._4_4_ = fVar157 * auVar10._4_4_;
  fVar158 = auVar207._8_4_;
  auVar143._8_4_ = fVar158 * auVar10._8_4_;
  fVar159 = auVar207._12_4_;
  auVar143._12_4_ = fVar159 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar143,auVar9,auVar11);
  auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar188._0_4_ = fVar181 * auVar10._0_4_;
  auVar188._4_4_ = fVar157 * auVar10._4_4_;
  auVar188._8_4_ = fVar158 * auVar10._8_4_;
  auVar188._12_4_ = fVar159 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar188,auVar9,auVar12);
  auVar9 = vdpps_avx(auVar277,auVar277,0x7f);
  auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar139 = auVar9._0_4_;
  auVar96 = SUB1612(ZEXT816(0),0);
  auVar231._4_12_ = auVar96;
  auVar231._0_4_ = fVar139;
  auVar10 = vrsqrtss_avx(auVar231,auVar231);
  fVar60 = auVar10._0_4_;
  auVar10 = vdpps_avx(auVar277,auVar78,0x7f);
  fVar60 = fVar60 * 1.5 + fVar139 * -0.5 * fVar60 * fVar60 * fVar60;
  fVar160 = auVar277._0_4_ * fVar60;
  fVar180 = auVar277._4_4_ * fVar60;
  fVar182 = auVar277._8_4_ * fVar60;
  fVar183 = auVar277._12_4_ * fVar60;
  auVar241._0_4_ = auVar78._0_4_ * fVar139;
  auVar241._4_4_ = auVar78._4_4_ * fVar139;
  auVar241._8_4_ = auVar78._8_4_ * fVar139;
  auVar241._12_4_ = auVar78._12_4_ * fVar139;
  fVar139 = auVar10._0_4_;
  auVar203._0_4_ = auVar277._0_4_ * fVar139;
  auVar203._4_4_ = auVar277._4_4_ * fVar139;
  auVar203._8_4_ = auVar277._8_4_ * fVar139;
  auVar203._12_4_ = auVar277._12_4_ * fVar139;
  auVar277 = vsubps_avx(auVar241,auVar203);
  auVar10 = vrcpss_avx(auVar231,auVar231);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar154 = auVar10._0_4_ * auVar9._0_4_;
  auVar9 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar155 = auVar9._0_4_;
  auVar220._4_12_ = auVar96;
  auVar220._0_4_ = fVar155;
  auVar10 = vrsqrtss_avx(auVar220,auVar220);
  fVar139 = auVar10._0_4_;
  fVar139 = fVar139 * 1.5 + fVar155 * -0.5 * fVar139 * fVar139 * fVar139;
  fVar248 = fVar139 * auVar11._0_4_;
  fVar261 = fVar139 * auVar11._4_4_;
  fVar262 = fVar139 * auVar11._8_4_;
  fVar263 = fVar139 * auVar11._12_4_;
  auVar10 = vdpps_avx(auVar11,auVar12,0x7f);
  auVar189._0_4_ = fVar155 * auVar12._0_4_;
  auVar189._4_4_ = fVar155 * auVar12._4_4_;
  auVar189._8_4_ = fVar155 * auVar12._8_4_;
  auVar189._12_4_ = fVar155 * auVar12._12_4_;
  fVar155 = auVar10._0_4_;
  auVar144._0_4_ = fVar155 * auVar11._0_4_;
  auVar144._4_4_ = fVar155 * auVar11._4_4_;
  auVar144._8_4_ = fVar155 * auVar11._8_4_;
  auVar144._12_4_ = fVar155 * auVar11._12_4_;
  auVar78 = vsubps_avx(auVar189,auVar144);
  auVar10 = vrcpss_avx(auVar220,auVar220);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,ZEXT416(0x40000000));
  fVar155 = auVar9._0_4_ * auVar10._0_4_;
  auVar9 = vshufps_avx(auVar99,auVar99,0xff);
  auVar221._0_4_ = auVar9._0_4_ * fVar160;
  auVar221._4_4_ = auVar9._4_4_ * fVar180;
  auVar221._8_4_ = auVar9._8_4_ * fVar182;
  auVar221._12_4_ = auVar9._12_4_ * fVar183;
  local_5b0 = vsubps_avx(auVar99,auVar221);
  auVar10 = vshufps_avx(auVar76,auVar76,0xff);
  auVar164._0_4_ = auVar10._0_4_ * fVar160 + fVar60 * auVar277._0_4_ * fVar154 * auVar9._0_4_;
  auVar164._4_4_ = auVar10._4_4_ * fVar180 + fVar60 * auVar277._4_4_ * fVar154 * auVar9._4_4_;
  auVar164._8_4_ = auVar10._8_4_ * fVar182 + fVar60 * auVar277._8_4_ * fVar154 * auVar9._8_4_;
  auVar164._12_4_ = auVar10._12_4_ * fVar183 + fVar60 * auVar277._12_4_ * fVar154 * auVar9._12_4_;
  auVar277 = vsubps_avx(auVar76,auVar164);
  local_5c0._0_4_ = auVar221._0_4_ + auVar99._0_4_;
  local_5c0._4_4_ = auVar221._4_4_ + auVar99._4_4_;
  fStack_5b8 = auVar221._8_4_ + auVar99._8_4_;
  fStack_5b4 = auVar221._12_4_ + auVar99._12_4_;
  auVar9 = vshufps_avx(auVar75,auVar75,0xff);
  auVar101._0_4_ = fVar248 * auVar9._0_4_;
  auVar101._4_4_ = fVar261 * auVar9._4_4_;
  auVar101._8_4_ = fVar262 * auVar9._8_4_;
  auVar101._12_4_ = fVar263 * auVar9._12_4_;
  local_5d0 = vsubps_avx(auVar75,auVar101);
  auVar10 = vshufps_avx(auVar207,auVar207,0xff);
  auVar79._0_4_ = fVar248 * auVar10._0_4_ + auVar9._0_4_ * fVar139 * auVar78._0_4_ * fVar155;
  auVar79._4_4_ = fVar261 * auVar10._4_4_ + auVar9._4_4_ * fVar139 * auVar78._4_4_ * fVar155;
  auVar79._8_4_ = fVar262 * auVar10._8_4_ + auVar9._8_4_ * fVar139 * auVar78._8_4_ * fVar155;
  auVar79._12_4_ = fVar263 * auVar10._12_4_ + auVar9._12_4_ * fVar139 * auVar78._12_4_ * fVar155;
  auVar9 = vsubps_avx(auVar207,auVar79);
  local_5e0._0_4_ = auVar75._0_4_ + auVar101._0_4_;
  local_5e0._4_4_ = auVar75._4_4_ + auVar101._4_4_;
  fStack_5d8 = auVar75._8_4_ + auVar101._8_4_;
  fStack_5d4 = auVar75._12_4_ + auVar101._12_4_;
  local_5f0._0_4_ = local_5b0._0_4_ + auVar277._0_4_ * 0.33333334;
  local_5f0._4_4_ = local_5b0._4_4_ + auVar277._4_4_ * 0.33333334;
  local_5f0._8_4_ = local_5b0._8_4_ + auVar277._8_4_ * 0.33333334;
  local_5f0._12_4_ = local_5b0._12_4_ + auVar277._12_4_ * 0.33333334;
  auVar80._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar80._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar80._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar80._12_4_ = auVar9._12_4_ * 0.33333334;
  local_600 = vsubps_avx(local_5d0,auVar80);
  local_590 = vsubps_avx(local_5b0,auVar64);
  auVar9 = vshufps_avx(local_590,local_590,0x55);
  auVar10 = vshufps_avx(local_590,local_590,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar60 = pre->ray_space[k].vz.field_0.m128[0];
  fVar139 = pre->ray_space[k].vz.field_0.m128[1];
  fVar154 = pre->ray_space[k].vz.field_0.m128[2];
  fVar155 = pre->ray_space[k].vz.field_0.m128[3];
  auVar81._0_4_ = fVar60 * auVar10._0_4_;
  auVar81._4_4_ = fVar139 * auVar10._4_4_;
  auVar81._8_4_ = fVar154 * auVar10._8_4_;
  auVar81._12_4_ = fVar155 * auVar10._12_4_;
  auVar277 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar2,auVar9);
  local_5a0 = vsubps_avx(local_5f0,auVar64);
  auVar9 = vshufps_avx(local_5a0,local_5a0,0x55);
  auVar10 = vshufps_avx(local_5a0,local_5a0,0xaa);
  auVar82._0_4_ = fVar60 * auVar10._0_4_;
  auVar82._4_4_ = fVar139 * auVar10._4_4_;
  auVar82._8_4_ = fVar154 * auVar10._8_4_;
  auVar82._12_4_ = fVar155 * auVar10._12_4_;
  auVar10 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar2,auVar9);
  local_3f0 = vsubps_avx(local_600,auVar64);
  auVar9 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar251._0_4_ = fVar60 * auVar9._0_4_;
  auVar251._4_4_ = fVar139 * auVar9._4_4_;
  auVar251._8_4_ = fVar154 * auVar9._8_4_;
  auVar251._12_4_ = fVar155 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar78 = vfmadd231ps_fma(auVar251,(undefined1  [16])aVar2,auVar9);
  local_400 = vsubps_avx(local_5d0,auVar64);
  auVar9 = vshufps_avx(local_400,local_400,0xaa);
  auVar83._0_4_ = fVar60 * auVar9._0_4_;
  auVar83._4_4_ = fVar139 * auVar9._4_4_;
  auVar83._8_4_ = fVar154 * auVar9._8_4_;
  auVar83._12_4_ = fVar155 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_400,local_400,0x55);
  auVar11 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar2,auVar9);
  local_410 = vsubps_avx(_local_5c0,auVar64);
  auVar9 = vshufps_avx(local_410,local_410,0xaa);
  auVar145._0_4_ = fVar60 * auVar9._0_4_;
  auVar145._4_4_ = fVar139 * auVar9._4_4_;
  auVar145._8_4_ = fVar154 * auVar9._8_4_;
  auVar145._12_4_ = fVar155 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_410,local_410,0x55);
  auVar12 = vfmadd231ps_fma(auVar145,(undefined1  [16])aVar2,auVar9);
  local_610._0_4_ = (fVar156 + auVar164._0_4_) * 0.33333334 + (float)local_5c0._0_4_;
  local_610._4_4_ = (fVar97 + auVar164._4_4_) * 0.33333334 + (float)local_5c0._4_4_;
  fStack_608 = (fVar98 + auVar164._8_4_) * 0.33333334 + fStack_5b8;
  fStack_604 = (fVar62 + auVar164._12_4_) * 0.33333334 + fStack_5b4;
  local_420 = vsubps_avx(_local_610,auVar64);
  auVar9 = vshufps_avx(local_420,local_420,0xaa);
  auVar204._0_4_ = auVar9._0_4_ * fVar60;
  auVar204._4_4_ = auVar9._4_4_ * fVar139;
  auVar204._8_4_ = auVar9._8_4_ * fVar154;
  auVar204._12_4_ = auVar9._12_4_ * fVar155;
  auVar9 = vshufps_avx(local_420,local_420,0x55);
  auVar63 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar2,auVar9);
  auVar222._0_4_ = (fVar181 + auVar79._0_4_) * 0.33333334;
  auVar222._4_4_ = (fVar157 + auVar79._4_4_) * 0.33333334;
  auVar222._8_4_ = (fVar158 + auVar79._8_4_) * 0.33333334;
  auVar222._12_4_ = (fVar159 + auVar79._12_4_) * 0.33333334;
  _local_620 = vsubps_avx(_local_5e0,auVar222);
  local_430 = vsubps_avx(_local_620,auVar64);
  auVar9 = vshufps_avx(local_430,local_430,0xaa);
  auVar223._0_4_ = auVar9._0_4_ * fVar60;
  auVar223._4_4_ = auVar9._4_4_ * fVar139;
  auVar223._8_4_ = auVar9._8_4_ * fVar154;
  auVar223._12_4_ = auVar9._12_4_ * fVar155;
  auVar9 = vshufps_avx(local_430,local_430,0x55);
  auVar99 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar2,auVar9);
  local_440 = vsubps_avx(_local_5e0,auVar64);
  auVar9 = vshufps_avx(local_440,local_440,0xaa);
  auVar84._0_4_ = fVar60 * auVar9._0_4_;
  auVar84._4_4_ = fVar139 * auVar9._4_4_;
  auVar84._8_4_ = fVar154 * auVar9._8_4_;
  auVar84._12_4_ = fVar155 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_440,local_440,0x55);
  auVar9 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar2,auVar9);
  auVar165._4_4_ = local_590._0_4_;
  auVar165._0_4_ = local_590._0_4_;
  auVar165._8_4_ = local_590._0_4_;
  auVar165._12_4_ = local_590._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar64 = vfmadd231ps_fma(auVar277,(undefined1  [16])aVar2,auVar165);
  auVar166._4_4_ = local_5a0._0_4_;
  auVar166._0_4_ = local_5a0._0_4_;
  auVar166._8_4_ = local_5a0._0_4_;
  auVar166._12_4_ = local_5a0._0_4_;
  auVar75 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar166);
  uVar61 = local_3f0._0_4_;
  auVar167._4_4_ = uVar61;
  auVar167._0_4_ = uVar61;
  auVar167._8_4_ = uVar61;
  auVar167._12_4_ = uVar61;
  auVar207 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar167);
  uVar61 = local_400._0_4_;
  auVar168._4_4_ = uVar61;
  auVar168._0_4_ = uVar61;
  auVar168._8_4_ = uVar61;
  auVar168._12_4_ = uVar61;
  auVar76 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar168);
  uVar61 = local_410._0_4_;
  auVar169._4_4_ = uVar61;
  auVar169._0_4_ = uVar61;
  auVar169._8_4_ = uVar61;
  auVar169._12_4_ = uVar61;
  auVar111 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar169);
  uVar61 = local_420._0_4_;
  auVar170._4_4_ = uVar61;
  auVar170._0_4_ = uVar61;
  auVar170._8_4_ = uVar61;
  auVar170._12_4_ = uVar61;
  auVar63 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar170);
  uVar61 = local_430._0_4_;
  auVar171._4_4_ = uVar61;
  auVar171._0_4_ = uVar61;
  auVar171._8_4_ = uVar61;
  auVar171._12_4_ = uVar61;
  auVar99 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar2,auVar171);
  uVar61 = local_440._0_4_;
  auVar172._4_4_ = uVar61;
  auVar172._0_4_ = uVar61;
  auVar172._8_4_ = uVar61;
  auVar172._12_4_ = uVar61;
  auVar66 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar172);
  auVar78 = vmovlhps_avx(auVar64,auVar111);
  auVar11 = vmovlhps_avx(auVar75,auVar63);
  auVar12 = vmovlhps_avx(auVar207,auVar99);
  _local_580 = vmovlhps_avx(auVar76,auVar66);
  auVar9 = vminps_avx(auVar78,auVar11);
  auVar10 = vminps_avx(auVar12,_local_580);
  auVar277 = vminps_avx(auVar9,auVar10);
  auVar9 = vmaxps_avx(auVar78,auVar11);
  auVar10 = vmaxps_avx(auVar12,_local_580);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vshufpd_avx(auVar277,auVar277,3);
  auVar277 = vminps_avx(auVar277,auVar10);
  auVar10 = vshufpd_avx(auVar9,auVar9,3);
  auVar10 = vmaxps_avx(auVar9,auVar10);
  auVar9 = vandps_avx(auVar282,auVar277);
  auVar10 = vandps_avx(auVar282,auVar10);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar10,auVar9);
  local_2e0 = auVar9._0_4_ * 9.536743e-07;
  local_500._8_8_ = auVar64._0_8_;
  local_500._0_8_ = auVar64._0_8_;
  local_510._8_8_ = auVar75._0_8_;
  local_510._0_8_ = auVar75._0_8_;
  local_520._0_8_ = auVar207._0_8_;
  local_520._8_8_ = local_520._0_8_;
  local_760._0_8_ = auVar76._0_8_;
  local_530._8_8_ = local_760._0_8_;
  local_530._0_8_ = local_760._0_8_;
  local_540 = auVar111._0_8_;
  register0x00001348 = local_540;
  register0x000013c8 = auVar63._0_8_;
  local_550 = auVar63._0_8_;
  register0x00001408 = auVar99._0_8_;
  local_560 = auVar99._0_8_;
  register0x00001448 = auVar66._0_8_;
  local_570 = auVar66._0_8_;
  local_3e0 = ZEXT416((uint)local_2e0);
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  fStack_2f8 = -local_2e0;
  local_300 = -local_2e0;
  fStack_2fc = -local_2e0;
  fStack_2f4 = fStack_2f8;
  fStack_2f0 = fStack_2f8;
  fStack_2ec = fStack_2f8;
  fStack_2e8 = fStack_2f8;
  fStack_2e4 = fStack_2f8;
  local_320 = uVar49;
  uStack_31c = uVar49;
  uStack_318 = uVar49;
  uStack_314 = uVar49;
  uStack_310 = uVar49;
  uStack_30c = uVar49;
  uStack_308 = uVar49;
  uStack_304 = uVar49;
  local_340 = uVar4;
  uStack_33c = uVar4;
  uStack_338 = uVar4;
  uStack_334 = uVar4;
  uStack_330 = uVar4;
  uStack_32c = uVar4;
  uStack_328 = uVar4;
  uStack_324 = uVar4;
  uVar53 = 0;
  fVar60 = *(float *)(ray + k * 4 + 0x60);
  local_3b0 = vsubps_avx(auVar11,auVar78);
  local_3c0 = vsubps_avx(auVar12,auVar11);
  local_3d0 = vsubps_avx(_local_580,auVar12);
  local_460 = vsubps_avx(_local_5c0,local_5b0);
  local_470 = vsubps_avx(_local_610,local_5f0);
  local_480 = vsubps_avx(_local_620,local_600);
  _local_490 = vsubps_avx(_local_5e0,local_5d0);
  local_760 = ZEXT816(0x3f80000000000000);
  local_450 = local_760;
  do {
    auVar9 = vshufps_avx(local_760,local_760,0x50);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = &DAT_3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar120._16_4_ = 0x3f800000;
    auVar120._0_16_ = auVar112;
    auVar120._20_4_ = 0x3f800000;
    auVar120._24_4_ = 0x3f800000;
    auVar120._28_4_ = 0x3f800000;
    auVar10 = vsubps_avx(auVar112,auVar9);
    fVar139 = auVar9._0_4_;
    auVar68._0_4_ = local_540._0_4_ * fVar139;
    fVar154 = auVar9._4_4_;
    auVar68._4_4_ = local_540._4_4_ * fVar154;
    fVar155 = auVar9._8_4_;
    auVar68._8_4_ = local_540._8_4_ * fVar155;
    fVar156 = auVar9._12_4_;
    auVar68._12_4_ = local_540._12_4_ * fVar156;
    auVar146._0_4_ = local_550._0_4_ * fVar139;
    auVar146._4_4_ = local_550._4_4_ * fVar154;
    auVar146._8_4_ = local_550._8_4_ * fVar155;
    auVar146._12_4_ = local_550._12_4_ * fVar156;
    auVar190._0_4_ = local_560._0_4_ * fVar139;
    auVar190._4_4_ = local_560._4_4_ * fVar154;
    auVar190._8_4_ = local_560._8_4_ * fVar155;
    auVar190._12_4_ = local_560._12_4_ * fVar156;
    auVar276._0_4_ = local_570._0_4_ * fVar139;
    auVar276._4_4_ = local_570._4_4_ * fVar154;
    auVar276._8_4_ = local_570._8_4_ * fVar155;
    auVar276._12_4_ = local_570._12_4_ * fVar156;
    auVar63 = vfmadd231ps_fma(auVar68,auVar10,local_500);
    auVar99 = vfmadd231ps_fma(auVar146,auVar10,local_510);
    auVar75 = vfmadd231ps_fma(auVar190,auVar10,local_520);
    auVar207 = vfmadd231ps_fma(auVar276,local_530,auVar10);
    local_700 = auVar207._0_4_;
    auVar9 = vmovshdup_avx(local_450);
    fVar139 = local_450._0_4_;
    fVar97 = (auVar9._0_4_ - fVar139) * 0.04761905;
    auVar217._4_4_ = fVar139;
    auVar217._0_4_ = fVar139;
    auVar217._8_4_ = fVar139;
    auVar217._12_4_ = fVar139;
    auVar217._16_4_ = fVar139;
    auVar217._20_4_ = fVar139;
    auVar217._24_4_ = fVar139;
    auVar217._28_4_ = fVar139;
    auVar108._0_8_ = auVar9._0_8_;
    auVar108._8_8_ = auVar108._0_8_;
    auVar108._16_8_ = auVar108._0_8_;
    auVar108._24_8_ = auVar108._0_8_;
    auVar71 = vsubps_avx(auVar108,auVar217);
    uVar61 = auVar63._0_4_;
    auVar286._4_4_ = uVar61;
    auVar286._0_4_ = uVar61;
    auVar286._8_4_ = uVar61;
    auVar286._12_4_ = uVar61;
    auVar286._16_4_ = uVar61;
    auVar286._20_4_ = uVar61;
    auVar286._24_4_ = uVar61;
    auVar286._28_4_ = uVar61;
    auVar9 = vmovshdup_avx(auVar63);
    uVar161 = auVar9._0_8_;
    auVar271._8_8_ = uVar161;
    auVar271._0_8_ = uVar161;
    auVar271._16_8_ = uVar161;
    auVar271._24_8_ = uVar161;
    fVar98 = auVar99._0_4_;
    auVar92._4_4_ = fVar98;
    auVar92._0_4_ = fVar98;
    auVar92._8_4_ = fVar98;
    auVar92._12_4_ = fVar98;
    auVar92._16_4_ = fVar98;
    auVar92._20_4_ = fVar98;
    auVar92._24_4_ = fVar98;
    auVar92._28_4_ = fVar98;
    auVar10 = vmovshdup_avx(auVar99);
    auVar177._0_8_ = auVar10._0_8_;
    auVar177._8_8_ = auVar177._0_8_;
    auVar177._16_8_ = auVar177._0_8_;
    auVar177._24_8_ = auVar177._0_8_;
    fVar157 = auVar75._0_4_;
    auVar247._4_4_ = fVar157;
    auVar247._0_4_ = fVar157;
    auVar247._8_4_ = fVar157;
    auVar247._12_4_ = fVar157;
    auVar247._16_4_ = fVar157;
    auVar247._20_4_ = fVar157;
    auVar247._24_4_ = fVar157;
    auVar247._28_4_ = fVar157;
    auVar277 = vmovshdup_avx(auVar75);
    auVar228._0_8_ = auVar277._0_8_;
    auVar228._8_8_ = auVar228._0_8_;
    auVar228._16_8_ = auVar228._0_8_;
    auVar228._24_8_ = auVar228._0_8_;
    auVar64 = vmovshdup_avx(auVar207);
    auVar76 = vfmadd132ps_fma(auVar71,auVar217,_DAT_02020f20);
    auVar71 = vsubps_avx(auVar120,ZEXT1632(auVar76));
    fVar139 = auVar76._0_4_;
    auVar279._0_4_ = fVar98 * fVar139;
    fVar154 = auVar76._4_4_;
    auVar279._4_4_ = fVar98 * fVar154;
    fVar155 = auVar76._8_4_;
    auVar279._8_4_ = fVar98 * fVar155;
    fVar156 = auVar76._12_4_;
    auVar279._12_4_ = fVar98 * fVar156;
    auVar279._16_4_ = fVar98 * 0.0;
    auVar279._20_4_ = fVar98 * 0.0;
    auVar279._24_4_ = fVar98 * 0.0;
    auVar279._28_4_ = 0;
    auVar76 = vfmadd231ps_fma(auVar279,auVar71,auVar286);
    fVar62 = auVar10._0_4_;
    auVar258._0_4_ = fVar62 * fVar139;
    fVar181 = auVar10._4_4_;
    auVar258._4_4_ = fVar181 * fVar154;
    auVar258._8_4_ = fVar62 * fVar155;
    auVar258._12_4_ = fVar181 * fVar156;
    auVar258._16_4_ = fVar62 * 0.0;
    auVar258._20_4_ = fVar181 * 0.0;
    auVar258._24_4_ = fVar62 * 0.0;
    auVar258._28_4_ = 0;
    auVar111 = vfmadd231ps_fma(auVar258,auVar71,auVar271);
    auVar14._4_4_ = fVar157 * fVar154;
    auVar14._0_4_ = fVar157 * fVar139;
    auVar14._8_4_ = fVar157 * fVar155;
    auVar14._12_4_ = fVar157 * fVar156;
    auVar14._16_4_ = fVar157 * 0.0;
    auVar14._20_4_ = fVar157 * 0.0;
    auVar14._24_4_ = fVar157 * 0.0;
    auVar14._28_4_ = auVar9._4_4_;
    auVar66 = vfmadd231ps_fma(auVar14,auVar71,auVar92);
    fVar62 = auVar277._0_4_;
    fVar181 = auVar277._4_4_;
    auVar73._4_4_ = fVar181 * fVar154;
    auVar73._0_4_ = fVar62 * fVar139;
    auVar73._8_4_ = fVar62 * fVar155;
    auVar73._12_4_ = fVar181 * fVar156;
    auVar73._16_4_ = fVar62 * 0.0;
    auVar73._20_4_ = fVar181 * 0.0;
    auVar73._24_4_ = fVar62 * 0.0;
    auVar73._28_4_ = uVar61;
    auVar130 = vfmadd231ps_fma(auVar73,auVar71,auVar177);
    auVar9 = vshufps_avx(auVar63,auVar63,0xaa);
    auVar178._0_8_ = auVar9._0_8_;
    auVar178._8_8_ = auVar178._0_8_;
    auVar178._16_8_ = auVar178._0_8_;
    auVar178._24_8_ = auVar178._0_8_;
    auVar10 = vshufps_avx(auVar63,auVar63,0xff);
    uStack_6b8 = auVar10._0_8_;
    local_6c0 = (undefined1  [8])uStack_6b8;
    uStack_6b0 = uStack_6b8;
    uStack_6a8 = uStack_6b8;
    auVar13._4_4_ = fVar154 * local_700;
    auVar13._0_4_ = fVar139 * local_700;
    auVar13._8_4_ = fVar155 * local_700;
    auVar13._12_4_ = fVar156 * local_700;
    auVar13._16_4_ = local_700 * 0.0;
    auVar13._20_4_ = local_700 * 0.0;
    auVar13._24_4_ = local_700 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar74 = vfmadd231ps_fma(auVar13,auVar71,auVar247);
    auVar277 = vshufps_avx(auVar99,auVar99,0xaa);
    auVar137._0_8_ = auVar277._0_8_;
    auVar137._8_8_ = auVar137._0_8_;
    auVar137._16_8_ = auVar137._0_8_;
    auVar137._24_8_ = auVar137._0_8_;
    auVar63 = vshufps_avx(auVar99,auVar99,0xff);
    auVar153._0_8_ = auVar63._0_8_;
    auVar153._8_8_ = auVar153._0_8_;
    auVar153._16_8_ = auVar153._0_8_;
    auVar153._24_8_ = auVar153._0_8_;
    fVar62 = auVar64._0_4_;
    fVar181 = auVar64._4_4_;
    auVar15._4_4_ = fVar181 * fVar154;
    auVar15._0_4_ = fVar62 * fVar139;
    auVar15._8_4_ = fVar62 * fVar155;
    auVar15._12_4_ = fVar181 * fVar156;
    auVar15._16_4_ = fVar62 * 0.0;
    auVar15._20_4_ = fVar181 * 0.0;
    auVar15._24_4_ = fVar62 * 0.0;
    auVar15._28_4_ = fVar157;
    auVar123 = vfmadd231ps_fma(auVar15,auVar71,auVar228);
    auVar16._28_4_ = fVar98;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar66._12_4_ * fVar156,
                            CONCAT48(auVar66._8_4_ * fVar155,
                                     CONCAT44(auVar66._4_4_ * fVar154,auVar66._0_4_ * fVar139))));
    auVar76 = vfmadd231ps_fma(auVar16,auVar71,ZEXT1632(auVar76));
    auVar17._28_4_ = auVar10._4_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar130._12_4_ * fVar156,
                            CONCAT48(auVar130._8_4_ * fVar155,
                                     CONCAT44(auVar130._4_4_ * fVar154,auVar130._0_4_ * fVar139))));
    auVar111 = vfmadd231ps_fma(auVar17,auVar71,ZEXT1632(auVar111));
    auVar10 = vshufps_avx(auVar75,auVar75,0xaa);
    uVar161 = auVar10._0_8_;
    auVar259._8_8_ = uVar161;
    auVar259._0_8_ = uVar161;
    auVar259._16_8_ = uVar161;
    auVar259._24_8_ = uVar161;
    auVar64 = vshufps_avx(auVar75,auVar75,0xff);
    uVar161 = auVar64._0_8_;
    auVar280._8_8_ = uVar161;
    auVar280._0_8_ = uVar161;
    auVar280._16_8_ = uVar161;
    auVar280._24_8_ = uVar161;
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar156 * auVar74._12_4_,
                                                 CONCAT48(fVar155 * auVar74._8_4_,
                                                          CONCAT44(fVar154 * auVar74._4_4_,
                                                                   fVar139 * auVar74._0_4_)))),
                              auVar71,ZEXT1632(auVar66));
    auVar99 = vshufps_avx(auVar207,auVar207,0xaa);
    auVar75 = vshufps_avx(auVar207,auVar207,0xff);
    local_700 = auVar75._0_4_;
    fStack_6fc = auVar75._4_4_;
    auVar260._28_4_ = fStack_6fc;
    auVar260._0_28_ =
         ZEXT1628(CONCAT412(auVar123._12_4_ * fVar156,
                            CONCAT48(auVar123._8_4_ * fVar155,
                                     CONCAT44(auVar123._4_4_ * fVar154,auVar123._0_4_ * fVar139))));
    auVar75 = vfmadd231ps_fma(auVar260,auVar71,ZEXT1632(auVar130));
    auVar207 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar156 * auVar66._12_4_,
                                                  CONCAT48(fVar155 * auVar66._8_4_,
                                                           CONCAT44(fVar154 * auVar66._4_4_,
                                                                    fVar139 * auVar66._0_4_)))),
                               auVar71,ZEXT1632(auVar76));
    auVar14 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar76));
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar156 * auVar75._12_4_,
                                                 CONCAT48(fVar155 * auVar75._8_4_,
                                                          CONCAT44(fVar154 * auVar75._4_4_,
                                                                   fVar139 * auVar75._0_4_)))),
                              auVar71,ZEXT1632(auVar111));
    auVar72 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar111));
    fVar160 = fVar97 * auVar14._0_4_ * 3.0;
    fVar182 = fVar97 * auVar14._4_4_ * 3.0;
    auVar18._4_4_ = fVar182;
    auVar18._0_4_ = fVar160;
    fVar248 = fVar97 * auVar14._8_4_ * 3.0;
    auVar18._8_4_ = fVar248;
    fVar262 = fVar97 * auVar14._12_4_ * 3.0;
    auVar18._12_4_ = fVar262;
    fVar237 = fVar97 * auVar14._16_4_ * 3.0;
    auVar18._16_4_ = fVar237;
    fVar238 = fVar97 * auVar14._20_4_ * 3.0;
    auVar18._20_4_ = fVar238;
    fVar239 = fVar97 * auVar14._24_4_ * 3.0;
    auVar18._24_4_ = fVar239;
    auVar18._28_4_ = 0x40400000;
    local_6e0._0_4_ = fVar97 * auVar72._0_4_ * 3.0;
    local_6e0._4_4_ = fVar97 * auVar72._4_4_ * 3.0;
    fStack_6d8 = fVar97 * auVar72._8_4_ * 3.0;
    fStack_6d4 = fVar97 * auVar72._12_4_ * 3.0;
    fStack_6d0 = fVar97 * auVar72._16_4_ * 3.0;
    fStack_6cc = fVar97 * auVar72._20_4_ * 3.0;
    fStack_6c8 = fVar97 * auVar72._24_4_ * 3.0;
    fStack_6c4 = auVar72._28_4_;
    fVar98 = auVar277._0_4_;
    fVar62 = auVar277._4_4_;
    auVar19._4_4_ = fVar62 * fVar154;
    auVar19._0_4_ = fVar98 * fVar139;
    auVar19._8_4_ = fVar98 * fVar155;
    auVar19._12_4_ = fVar62 * fVar156;
    auVar19._16_4_ = fVar98 * 0.0;
    auVar19._20_4_ = fVar62 * 0.0;
    auVar19._24_4_ = fVar98 * 0.0;
    auVar19._28_4_ = auVar14._28_4_;
    auVar277 = vfmadd231ps_fma(auVar19,auVar71,auVar178);
    fVar98 = auVar63._0_4_;
    fVar181 = auVar63._4_4_;
    auVar20._4_4_ = fVar181 * fVar154;
    auVar20._0_4_ = fVar98 * fVar139;
    auVar20._8_4_ = fVar98 * fVar155;
    auVar20._12_4_ = fVar181 * fVar156;
    auVar20._16_4_ = fVar98 * 0.0;
    auVar20._20_4_ = fVar181 * 0.0;
    auVar20._24_4_ = fVar98 * 0.0;
    auVar20._28_4_ = auVar9._4_4_;
    auVar9 = vfmadd231ps_fma(auVar20,auVar71,_local_6c0);
    fVar98 = auVar10._0_4_;
    fVar181 = auVar10._4_4_;
    auVar21._4_4_ = fVar181 * fVar154;
    auVar21._0_4_ = fVar98 * fVar139;
    auVar21._8_4_ = fVar98 * fVar155;
    auVar21._12_4_ = fVar181 * fVar156;
    auVar21._16_4_ = fVar98 * 0.0;
    auVar21._20_4_ = fVar181 * 0.0;
    auVar21._24_4_ = fVar98 * 0.0;
    auVar21._28_4_ = fVar97;
    auVar10 = vfmadd231ps_fma(auVar21,auVar71,auVar137);
    fVar98 = auVar64._0_4_;
    fVar157 = auVar64._4_4_;
    auVar22._4_4_ = fVar157 * fVar154;
    auVar22._0_4_ = fVar98 * fVar139;
    auVar22._8_4_ = fVar98 * fVar155;
    auVar22._12_4_ = fVar157 * fVar156;
    auVar22._16_4_ = fVar98 * 0.0;
    auVar22._20_4_ = fVar157 * 0.0;
    auVar22._24_4_ = fVar98 * 0.0;
    auVar22._28_4_ = fVar62;
    auVar64 = vfmadd231ps_fma(auVar22,auVar71,auVar153);
    local_4e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar207));
    fVar98 = auVar99._0_4_;
    fVar62 = auVar99._4_4_;
    auVar23._4_4_ = fVar62 * fVar154;
    auVar23._0_4_ = fVar98 * fVar139;
    auVar23._8_4_ = fVar98 * fVar155;
    auVar23._12_4_ = fVar62 * fVar156;
    auVar23._16_4_ = fVar98 * 0.0;
    auVar23._20_4_ = fVar62 * 0.0;
    auVar23._24_4_ = fVar98 * 0.0;
    auVar23._28_4_ = local_4e0._28_4_;
    auVar63 = vfmadd231ps_fma(auVar23,auVar71,auVar259);
    auVar15 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar76));
    auVar24._4_4_ = fVar154 * fStack_6fc;
    auVar24._0_4_ = fVar139 * local_700;
    auVar24._8_4_ = fVar155 * local_700;
    auVar24._12_4_ = fVar156 * fStack_6fc;
    auVar24._16_4_ = local_700 * 0.0;
    auVar24._20_4_ = fStack_6fc * 0.0;
    auVar24._24_4_ = local_700 * 0.0;
    auVar24._28_4_ = fVar181;
    auVar99 = vfmadd231ps_fma(auVar24,auVar71,auVar280);
    auVar25._28_4_ = fVar62;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar156 * auVar10._12_4_,
                            CONCAT48(fVar155 * auVar10._8_4_,
                                     CONCAT44(fVar154 * auVar10._4_4_,fVar139 * auVar10._0_4_))));
    auVar277 = vfmadd231ps_fma(auVar25,auVar71,ZEXT1632(auVar277));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar156 * auVar64._12_4_,
                                                CONCAT48(fVar155 * auVar64._8_4_,
                                                         CONCAT44(fVar154 * auVar64._4_4_,
                                                                  fVar139 * auVar64._0_4_)))),
                             auVar71,ZEXT1632(auVar9));
    fVar160 = auVar207._0_4_ + fVar160;
    fVar182 = auVar207._4_4_ + fVar182;
    fVar248 = auVar207._8_4_ + fVar248;
    fVar262 = auVar207._12_4_ + fVar262;
    fVar237 = fVar237 + 0.0;
    fVar238 = fVar238 + 0.0;
    fVar239 = fVar239 + 0.0;
    auVar26._28_4_ = 0x40400000;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar99._12_4_ * fVar156,
                            CONCAT48(auVar99._8_4_ * fVar155,
                                     CONCAT44(auVar99._4_4_ * fVar154,auVar99._0_4_ * fVar139))));
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar156 * auVar63._12_4_,
                                                 CONCAT48(fVar155 * auVar63._8_4_,
                                                          CONCAT44(fVar154 * auVar63._4_4_,
                                                                   fVar139 * auVar63._0_4_)))),
                              auVar71,ZEXT1632(auVar10));
    auVar64 = vfmadd231ps_fma(auVar26,auVar71,ZEXT1632(auVar64));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar156 * auVar10._12_4_,
                                                 CONCAT48(fVar155 * auVar10._8_4_,
                                                          CONCAT44(fVar154 * auVar10._4_4_,
                                                                   fVar139 * auVar10._0_4_)))),
                              auVar71,ZEXT1632(auVar277));
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar156 * auVar64._12_4_,
                                                 CONCAT48(fVar155 * auVar64._8_4_,
                                                          CONCAT44(fVar154 * auVar64._4_4_,
                                                                   fVar139 * auVar64._0_4_)))),
                              ZEXT1632(auVar9),auVar71);
    auVar71 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar277));
    auVar14 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar9));
    fVar139 = fVar97 * auVar71._0_4_ * 3.0;
    fVar154 = fVar97 * auVar71._4_4_ * 3.0;
    auVar27._4_4_ = fVar154;
    auVar27._0_4_ = fVar139;
    fVar155 = fVar97 * auVar71._8_4_ * 3.0;
    auVar27._8_4_ = fVar155;
    fVar156 = fVar97 * auVar71._12_4_ * 3.0;
    auVar27._12_4_ = fVar156;
    fVar157 = fVar97 * auVar71._16_4_ * 3.0;
    auVar27._16_4_ = fVar157;
    fVar158 = fVar97 * auVar71._20_4_ * 3.0;
    auVar27._20_4_ = fVar158;
    fVar159 = fVar97 * auVar71._24_4_ * 3.0;
    auVar27._24_4_ = fVar159;
    auVar27._28_4_ = 0x40400000;
    auVar199._0_4_ = fVar97 * auVar14._0_4_ * 3.0;
    auVar199._4_4_ = fVar97 * auVar14._4_4_ * 3.0;
    auVar199._8_4_ = fVar97 * auVar14._8_4_ * 3.0;
    auVar199._12_4_ = fVar97 * auVar14._12_4_ * 3.0;
    auVar199._16_4_ = fVar97 * auVar14._16_4_ * 3.0;
    auVar199._20_4_ = fVar97 * auVar14._20_4_ * 3.0;
    auVar199._24_4_ = fVar97 * auVar14._24_4_ * 3.0;
    auVar199._28_4_ = 0;
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar63));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar99));
    auVar71 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar207));
    auVar14 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar76));
    auVar73 = vsubps_avx(auVar16,local_4e0);
    fVar180 = auVar71._0_4_ + auVar73._0_4_;
    fVar183 = auVar71._4_4_ + auVar73._4_4_;
    fVar261 = auVar71._8_4_ + auVar73._8_4_;
    fVar263 = auVar71._12_4_ + auVar73._12_4_;
    fVar184 = auVar71._16_4_ + auVar73._16_4_;
    fVar185 = auVar71._20_4_ + auVar73._20_4_;
    fVar186 = auVar71._24_4_ + auVar73._24_4_;
    auVar13 = vsubps_avx(local_1c0,auVar15);
    auVar272._0_4_ = auVar14._0_4_ + auVar13._0_4_;
    auVar272._4_4_ = auVar14._4_4_ + auVar13._4_4_;
    auVar272._8_4_ = auVar14._8_4_ + auVar13._8_4_;
    auVar272._12_4_ = auVar14._12_4_ + auVar13._12_4_;
    auVar272._16_4_ = auVar14._16_4_ + auVar13._16_4_;
    auVar272._20_4_ = auVar14._20_4_ + auVar13._20_4_;
    auVar272._24_4_ = auVar14._24_4_ + auVar13._24_4_;
    auVar272._28_4_ = auVar14._28_4_ + auVar13._28_4_;
    fVar97 = auVar76._0_4_;
    local_2a0 = fVar97 + (float)local_6e0._0_4_;
    fVar98 = auVar76._4_4_;
    fStack_29c = fVar98 + (float)local_6e0._4_4_;
    fVar62 = auVar76._8_4_;
    fStack_298 = fVar62 + fStack_6d8;
    fVar181 = auVar76._12_4_;
    fStack_294 = fVar181 + fStack_6d4;
    fStack_290 = fStack_6d0 + 0.0;
    fStack_28c = fStack_6cc + 0.0;
    fStack_288 = fStack_6c8 + 0.0;
    fStack_284 = auVar72._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar207);
    auVar14 = vsubps_avx(local_1e0,auVar18);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_200 = ZEXT1632(auVar76);
    auVar14 = vsubps_avx(local_200,_local_6e0);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_240._0_4_ = auVar63._0_4_ + fVar139;
    local_240._4_4_ = auVar63._4_4_ + fVar154;
    local_240._8_4_ = auVar63._8_4_ + fVar155;
    local_240._12_4_ = auVar63._12_4_ + fVar156;
    local_240._16_4_ = fVar157 + 0.0;
    local_240._20_4_ = fVar158 + 0.0;
    local_240._24_4_ = fVar159 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar260 = ZEXT1632(auVar63);
    auVar14 = vsubps_avx(auVar260,auVar27);
    auVar17 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    fVar139 = auVar99._0_4_;
    local_280._0_4_ = fVar139 + auVar199._0_4_;
    fVar154 = auVar99._4_4_;
    local_280._4_4_ = fVar154 + auVar199._4_4_;
    fVar155 = auVar99._8_4_;
    local_280._8_4_ = fVar155 + auVar199._8_4_;
    fVar156 = auVar99._12_4_;
    local_280._12_4_ = fVar156 + auVar199._12_4_;
    local_280._16_4_ = auVar199._16_4_ + 0.0;
    local_280._20_4_ = auVar199._20_4_ + 0.0;
    local_280._24_4_ = auVar199._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar14 = vsubps_avx(ZEXT1632(auVar99),auVar199);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    auVar28._4_4_ = fVar98 * fVar183;
    auVar28._0_4_ = fVar97 * fVar180;
    auVar28._8_4_ = fVar62 * fVar261;
    auVar28._12_4_ = fVar181 * fVar263;
    auVar28._16_4_ = fVar184 * 0.0;
    auVar28._20_4_ = fVar185 * 0.0;
    auVar28._24_4_ = fVar186 * 0.0;
    auVar28._28_4_ = auVar14._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar28,local_1e0,auVar272);
    auVar29._4_4_ = fStack_29c * fVar183;
    auVar29._0_4_ = local_2a0 * fVar180;
    auVar29._8_4_ = fStack_298 * fVar261;
    auVar29._12_4_ = fStack_294 * fVar263;
    auVar29._16_4_ = fStack_290 * fVar184;
    auVar29._20_4_ = fStack_28c * fVar185;
    auVar29._24_4_ = fStack_288 * fVar186;
    auVar29._28_4_ = auVar17._28_4_;
    auVar42._4_4_ = fVar182;
    auVar42._0_4_ = fVar160;
    auVar42._8_4_ = fVar248;
    auVar42._12_4_ = fVar262;
    auVar42._16_4_ = fVar237;
    auVar42._20_4_ = fVar238;
    auVar42._24_4_ = fVar239;
    auVar42._28_4_ = 0x40400000;
    auVar10 = vfnmadd231ps_fma(auVar29,auVar272,auVar42);
    auVar30._4_4_ = local_2c0._4_4_ * fVar183;
    auVar30._0_4_ = local_2c0._0_4_ * fVar180;
    auVar30._8_4_ = local_2c0._8_4_ * fVar261;
    auVar30._12_4_ = local_2c0._12_4_ * fVar263;
    auVar30._16_4_ = local_2c0._16_4_ * fVar184;
    auVar30._20_4_ = local_2c0._20_4_ * fVar185;
    auVar30._24_4_ = local_2c0._24_4_ * fVar186;
    auVar30._28_4_ = fStack_284;
    auVar277 = vfnmadd231ps_fma(auVar30,local_220,auVar272);
    local_6c0._0_4_ = auVar15._0_4_;
    local_6c0._4_4_ = auVar15._4_4_;
    uStack_6b8._0_4_ = auVar15._8_4_;
    uStack_6b8._4_4_ = auVar15._12_4_;
    uStack_6b0._0_4_ = auVar15._16_4_;
    uStack_6b0._4_4_ = auVar15._20_4_;
    uStack_6a8._0_4_ = auVar15._24_4_;
    auVar31._4_4_ = fVar183 * (float)local_6c0._4_4_;
    auVar31._0_4_ = fVar180 * (float)local_6c0._0_4_;
    auVar31._8_4_ = fVar261 * (float)uStack_6b8;
    auVar31._12_4_ = fVar263 * uStack_6b8._4_4_;
    auVar31._16_4_ = fVar184 * (float)uStack_6b0;
    auVar31._20_4_ = fVar185 * uStack_6b0._4_4_;
    auVar31._24_4_ = fVar186 * (float)uStack_6a8;
    auVar31._28_4_ = local_2c0._28_4_;
    auVar64 = vfnmadd231ps_fma(auVar31,local_4e0,auVar272);
    auVar48._4_4_ = fVar154 * fVar183;
    auVar48._0_4_ = fVar139 * fVar180;
    auVar48._8_4_ = fVar155 * fVar261;
    auVar48._12_4_ = fVar156 * fVar263;
    auVar48._16_4_ = fVar184 * 0.0;
    auVar48._20_4_ = fVar185 * 0.0;
    auVar48._24_4_ = fVar186 * 0.0;
    auVar48._28_4_ = DAT_0205d4a0._28_4_;
    auVar63 = vfnmadd231ps_fma(auVar48,auVar260,auVar272);
    auVar32._4_4_ = local_280._4_4_ * fVar183;
    auVar32._0_4_ = local_280._0_4_ * fVar180;
    auVar32._8_4_ = local_280._8_4_ * fVar261;
    auVar32._12_4_ = local_280._12_4_ * fVar263;
    auVar32._16_4_ = local_280._16_4_ * fVar184;
    auVar32._20_4_ = local_280._20_4_ * fVar185;
    auVar32._24_4_ = local_280._24_4_ * fVar186;
    auVar32._28_4_ = local_4e0._28_4_;
    auVar75 = vfnmadd231ps_fma(auVar32,local_240,auVar272);
    auVar33._4_4_ = local_260._4_4_ * fVar183;
    auVar33._0_4_ = local_260._0_4_ * fVar180;
    auVar33._8_4_ = local_260._8_4_ * fVar261;
    auVar33._12_4_ = local_260._12_4_ * fVar263;
    auVar33._16_4_ = local_260._16_4_ * fVar184;
    auVar33._20_4_ = local_260._20_4_ * fVar185;
    auVar33._24_4_ = local_260._24_4_ * fVar186;
    auVar33._28_4_ = local_220._28_4_;
    auVar207 = vfnmadd231ps_fma(auVar33,auVar272,auVar17);
    auVar34._4_4_ = local_1c0._4_4_ * fVar183;
    auVar34._0_4_ = local_1c0._0_4_ * fVar180;
    auVar34._8_4_ = local_1c0._8_4_ * fVar261;
    auVar34._12_4_ = local_1c0._12_4_ * fVar263;
    auVar34._16_4_ = local_1c0._16_4_ * fVar184;
    auVar34._20_4_ = local_1c0._20_4_ * fVar185;
    auVar34._24_4_ = local_1c0._24_4_ * fVar186;
    auVar34._28_4_ = auVar71._28_4_ + auVar73._28_4_;
    auVar76 = vfnmadd231ps_fma(auVar34,auVar272,auVar16);
    auVar14 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar71 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar72 = vminps_avx(ZEXT1632(auVar277),ZEXT1632(auVar64));
    auVar72 = vminps_avx(auVar14,auVar72);
    auVar14 = vmaxps_avx(ZEXT1632(auVar277),ZEXT1632(auVar64));
    auVar71 = vmaxps_avx(auVar71,auVar14);
    auVar73 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar75));
    auVar14 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar75));
    auVar13 = vminps_avx(ZEXT1632(auVar207),ZEXT1632(auVar76));
    auVar73 = vminps_avx(auVar73,auVar13);
    auVar73 = vminps_avx(auVar72,auVar73);
    auVar72 = vmaxps_avx(ZEXT1632(auVar207),ZEXT1632(auVar76));
    auVar14 = vmaxps_avx(auVar14,auVar72);
    auVar14 = vmaxps_avx(auVar71,auVar14);
    auVar47._4_4_ = fStack_2dc;
    auVar47._0_4_ = local_2e0;
    auVar47._8_4_ = fStack_2d8;
    auVar47._12_4_ = fStack_2d4;
    auVar47._16_4_ = fStack_2d0;
    auVar47._20_4_ = fStack_2cc;
    auVar47._24_4_ = fStack_2c8;
    auVar47._28_4_ = fStack_2c4;
    auVar71 = vcmpps_avx(auVar73,auVar47,2);
    auVar46._4_4_ = fStack_2fc;
    auVar46._0_4_ = local_300;
    auVar46._8_4_ = fStack_2f8;
    auVar46._12_4_ = fStack_2f4;
    auVar46._16_4_ = fStack_2f0;
    auVar46._20_4_ = fStack_2ec;
    auVar46._24_4_ = fStack_2e8;
    auVar46._28_4_ = fStack_2e4;
    auVar14 = vcmpps_avx(auVar14,auVar46,5);
    auVar71 = vandps_avx(auVar14,auVar71);
    auVar14 = local_3a0 & auVar71;
    uVar51 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(local_4e0,local_1e0);
      auVar72 = vsubps_avx(auVar16,auVar260);
      fVar158 = auVar14._0_4_ + auVar72._0_4_;
      fVar159 = auVar14._4_4_ + auVar72._4_4_;
      fVar180 = auVar14._8_4_ + auVar72._8_4_;
      fVar183 = auVar14._12_4_ + auVar72._12_4_;
      fVar261 = auVar14._16_4_ + auVar72._16_4_;
      fVar263 = auVar14._20_4_ + auVar72._20_4_;
      fVar184 = auVar14._24_4_ + auVar72._24_4_;
      auVar73 = vsubps_avx(auVar15,local_200);
      auVar13 = vsubps_avx(local_1c0,ZEXT1632(auVar99));
      auVar93._0_4_ = auVar73._0_4_ + auVar13._0_4_;
      auVar93._4_4_ = auVar73._4_4_ + auVar13._4_4_;
      auVar93._8_4_ = auVar73._8_4_ + auVar13._8_4_;
      auVar93._12_4_ = auVar73._12_4_ + auVar13._12_4_;
      auVar93._16_4_ = auVar73._16_4_ + auVar13._16_4_;
      auVar93._20_4_ = auVar73._20_4_ + auVar13._20_4_;
      auVar93._24_4_ = auVar73._24_4_ + auVar13._24_4_;
      fVar157 = auVar13._28_4_;
      auVar93._28_4_ = auVar73._28_4_ + fVar157;
      auVar281._0_4_ = fVar97 * fVar158;
      auVar281._4_4_ = fVar98 * fVar159;
      auVar281._8_4_ = fVar62 * fVar180;
      auVar281._12_4_ = fVar181 * fVar183;
      auVar281._16_4_ = fVar261 * 0.0;
      auVar281._20_4_ = fVar263 * 0.0;
      auVar281._24_4_ = fVar184 * 0.0;
      auVar281._28_4_ = 0;
      auVar63 = vfnmadd231ps_fma(auVar281,auVar93,local_1e0);
      auVar35._4_4_ = fVar159 * fStack_29c;
      auVar35._0_4_ = fVar158 * local_2a0;
      auVar35._8_4_ = fVar180 * fStack_298;
      auVar35._12_4_ = fVar183 * fStack_294;
      auVar35._16_4_ = fVar261 * fStack_290;
      auVar35._20_4_ = fVar263 * fStack_28c;
      auVar35._24_4_ = fVar184 * fStack_288;
      auVar35._28_4_ = fVar157;
      auVar43._4_4_ = fVar182;
      auVar43._0_4_ = fVar160;
      auVar43._8_4_ = fVar248;
      auVar43._12_4_ = fVar262;
      auVar43._16_4_ = fVar237;
      auVar43._20_4_ = fVar238;
      auVar43._24_4_ = fVar239;
      auVar43._28_4_ = 0x40400000;
      auVar9 = vfnmadd213ps_fma(auVar43,auVar93,auVar35);
      auVar36._4_4_ = fVar159 * local_2c0._4_4_;
      auVar36._0_4_ = fVar158 * local_2c0._0_4_;
      auVar36._8_4_ = fVar180 * local_2c0._8_4_;
      auVar36._12_4_ = fVar183 * local_2c0._12_4_;
      auVar36._16_4_ = fVar261 * local_2c0._16_4_;
      auVar36._20_4_ = fVar263 * local_2c0._20_4_;
      auVar36._24_4_ = fVar184 * local_2c0._24_4_;
      auVar36._28_4_ = fVar157;
      auVar10 = vfnmadd213ps_fma(local_220,auVar93,auVar36);
      auVar37._4_4_ = (float)local_6c0._4_4_ * fVar159;
      auVar37._0_4_ = (float)local_6c0._0_4_ * fVar158;
      auVar37._8_4_ = (float)uStack_6b8 * fVar180;
      auVar37._12_4_ = uStack_6b8._4_4_ * fVar183;
      auVar37._16_4_ = (float)uStack_6b0 * fVar261;
      auVar37._20_4_ = uStack_6b0._4_4_ * fVar263;
      auVar37._24_4_ = (float)uStack_6a8 * fVar184;
      auVar37._28_4_ = fVar157;
      auVar99 = vfnmadd231ps_fma(auVar37,auVar93,local_4e0);
      auVar109._0_4_ = fVar139 * fVar158;
      auVar109._4_4_ = fVar154 * fVar159;
      auVar109._8_4_ = fVar155 * fVar180;
      auVar109._12_4_ = fVar156 * fVar183;
      auVar109._16_4_ = fVar261 * 0.0;
      auVar109._20_4_ = fVar263 * 0.0;
      auVar109._24_4_ = fVar184 * 0.0;
      auVar109._28_4_ = 0;
      auVar75 = vfnmadd231ps_fma(auVar109,auVar93,auVar260);
      auVar38._4_4_ = fVar159 * local_280._4_4_;
      auVar38._0_4_ = fVar158 * local_280._0_4_;
      auVar38._8_4_ = fVar180 * local_280._8_4_;
      auVar38._12_4_ = fVar183 * local_280._12_4_;
      auVar38._16_4_ = fVar261 * local_280._16_4_;
      auVar38._20_4_ = fVar263 * local_280._20_4_;
      auVar38._24_4_ = fVar184 * local_280._24_4_;
      auVar38._28_4_ = auVar15._28_4_;
      auVar277 = vfnmadd213ps_fma(local_240,auVar93,auVar38);
      auVar39._4_4_ = fVar159 * local_260._4_4_;
      auVar39._0_4_ = fVar158 * local_260._0_4_;
      auVar39._8_4_ = fVar180 * local_260._8_4_;
      auVar39._12_4_ = fVar183 * local_260._12_4_;
      auVar39._16_4_ = fVar261 * local_260._16_4_;
      auVar39._20_4_ = fVar263 * local_260._20_4_;
      auVar39._24_4_ = fVar184 * local_260._24_4_;
      auVar39._28_4_ = auVar15._28_4_;
      auVar64 = vfnmadd213ps_fma(auVar17,auVar93,auVar39);
      auVar40._4_4_ = local_1c0._4_4_ * fVar159;
      auVar40._0_4_ = local_1c0._0_4_ * fVar158;
      auVar40._8_4_ = local_1c0._8_4_ * fVar180;
      auVar40._12_4_ = local_1c0._12_4_ * fVar183;
      auVar40._16_4_ = local_1c0._16_4_ * fVar261;
      auVar40._20_4_ = local_1c0._20_4_ * fVar263;
      auVar40._24_4_ = local_1c0._24_4_ * fVar184;
      auVar40._28_4_ = auVar14._28_4_ + auVar72._28_4_;
      auVar207 = vfnmadd231ps_fma(auVar40,auVar93,auVar16);
      auVar72 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar9));
      auVar14 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar9));
      auVar73 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar99));
      auVar73 = vminps_avx(auVar72,auVar73);
      auVar72 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar99));
      auVar14 = vmaxps_avx(auVar14,auVar72);
      auVar13 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar277));
      auVar72 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar277));
      auVar15 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar207));
      auVar13 = vminps_avx(auVar13,auVar15);
      auVar13 = vminps_avx(auVar73,auVar13);
      auVar73 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar207));
      auVar72 = vmaxps_avx(auVar72,auVar73);
      auVar72 = vmaxps_avx(auVar14,auVar72);
      auVar14 = vcmpps_avx(auVar13,auVar47,2);
      auVar72 = vcmpps_avx(auVar72,auVar46,5);
      auVar14 = vandps_avx(auVar72,auVar14);
      auVar71 = vandps_avx(auVar71,local_3a0);
      auVar72 = auVar71 & auVar14;
      if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0x7f,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar72 >> 0xbf,0) != '\0') ||
          (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar72[0x1f] < '\0') {
        auVar71 = vandps_avx(auVar14,auVar71);
        uVar51 = vmovmskps_avx(auVar71);
      }
    }
    if (uVar51 != 0) {
      auStack_4f0[uVar53] = uVar51;
      uVar161 = vmovlps_avx(local_450);
      *(undefined8 *)(&uStack_380 + uVar53 * 2) = uVar161;
      uVar58 = vmovlps_avx(local_760);
      auStack_1a0[uVar53] = uVar58;
      uVar53 = (ulong)((int)uVar53 + 1);
    }
    do {
      if ((int)uVar53 == 0) {
        uVar61 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar70._4_4_ = uVar61;
        auVar70._0_4_ = uVar61;
        auVar70._8_4_ = uVar61;
        auVar70._12_4_ = uVar61;
        auVar9 = vcmpps_avx(local_4a0,auVar70,2);
        uVar49 = vmovmskps_avx(auVar9);
        uVar49 = (uint)uVar59 & uVar49;
        if (uVar49 == 0) {
          return;
        }
        goto LAB_016d98bc;
      }
      uVar52 = (int)uVar53 - 1;
      uVar54 = (ulong)uVar52;
      uVar57 = auStack_4f0[uVar54];
      uVar51 = (&uStack_380)[uVar54 * 2];
      fVar139 = afStack_37c[uVar54 * 2];
      iVar50 = 0;
      for (uVar58 = (ulong)uVar57; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
        iVar50 = iVar50 + 1;
      }
      uVar57 = uVar57 - 1 & uVar57;
      if (uVar57 == 0) {
        uVar53 = (ulong)uVar52;
      }
      local_760._8_8_ = 0;
      local_760._0_8_ = auStack_1a0[uVar54];
      auStack_4f0[uVar54] = uVar57;
      fVar154 = (float)(iVar50 + 1) * 0.14285715;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * (float)iVar50 * 0.14285715)),ZEXT416(uVar51)
                               ,ZEXT416((uint)(1.0 - (float)iVar50 * 0.14285715)));
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar154)),ZEXT416(uVar51),
                                ZEXT416((uint)(1.0 - fVar154)));
      auVar179._0_4_ = auVar9._0_4_;
      fVar154 = auVar10._0_4_;
      fVar139 = fVar154 - auVar179._0_4_;
      if (0.16666667 <= fVar139) break;
      auVar277 = vshufps_avx(local_760,local_760,0x50);
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = &DAT_3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar64 = vsubps_avx(auVar102,auVar277);
      fVar155 = auVar277._0_4_;
      auVar113._0_4_ = fVar155 * (float)local_540._0_4_;
      fVar156 = auVar277._4_4_;
      auVar113._4_4_ = fVar156 * (float)local_540._4_4_;
      fVar97 = auVar277._8_4_;
      auVar113._8_4_ = fVar97 * fStack_538;
      fVar98 = auVar277._12_4_;
      auVar113._12_4_ = fVar98 * fStack_534;
      auVar128._0_4_ = fVar155 * (float)local_550._0_4_;
      auVar128._4_4_ = fVar156 * (float)local_550._4_4_;
      auVar128._8_4_ = fVar97 * fStack_548;
      auVar128._12_4_ = fVar98 * fStack_544;
      auVar147._0_4_ = fVar155 * (float)local_560._0_4_;
      auVar147._4_4_ = fVar156 * (float)local_560._4_4_;
      auVar147._8_4_ = fVar97 * fStack_558;
      auVar147._12_4_ = fVar98 * fStack_554;
      auVar85._0_4_ = fVar155 * (float)local_570._0_4_;
      auVar85._4_4_ = fVar156 * (float)local_570._4_4_;
      auVar85._8_4_ = fVar97 * fStack_568;
      auVar85._12_4_ = fVar98 * fStack_564;
      auVar277 = vfmadd231ps_fma(auVar113,auVar64,local_500);
      auVar63 = vfmadd231ps_fma(auVar128,auVar64,local_510);
      auVar99 = vfmadd231ps_fma(auVar147,auVar64,local_520);
      auVar64 = vfmadd231ps_fma(auVar85,auVar64,local_530);
      auVar110._16_16_ = auVar277;
      auVar110._0_16_ = auVar277;
      auVar121._16_16_ = auVar63;
      auVar121._0_16_ = auVar63;
      auVar138._16_16_ = auVar99;
      auVar138._0_16_ = auVar99;
      auVar179._4_4_ = auVar179._0_4_;
      auVar179._8_4_ = auVar179._0_4_;
      auVar179._12_4_ = auVar179._0_4_;
      auVar179._20_4_ = fVar154;
      auVar179._16_4_ = fVar154;
      auVar179._24_4_ = fVar154;
      auVar179._28_4_ = fVar154;
      auVar71 = vsubps_avx(auVar121,auVar110);
      auVar63 = vfmadd213ps_fma(auVar71,auVar179,auVar110);
      auVar71 = vsubps_avx(auVar138,auVar121);
      auVar75 = vfmadd213ps_fma(auVar71,auVar179,auVar121);
      auVar277 = vsubps_avx(auVar64,auVar99);
      auVar122._16_16_ = auVar277;
      auVar122._0_16_ = auVar277;
      auVar277 = vfmadd213ps_fma(auVar122,auVar179,auVar138);
      auVar71 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar63));
      auVar64 = vfmadd213ps_fma(auVar71,auVar179,ZEXT1632(auVar63));
      auVar71 = vsubps_avx(ZEXT1632(auVar277),ZEXT1632(auVar75));
      auVar277 = vfmadd213ps_fma(auVar71,auVar179,ZEXT1632(auVar75));
      auVar71 = vsubps_avx(ZEXT1632(auVar277),ZEXT1632(auVar64));
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar71,auVar179);
      fVar181 = auVar71._4_4_ * 3.0;
      fVar62 = fVar139 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar111._4_4_ + fVar62 * fVar181,auVar111._0_4_ + fVar62 * auVar71._0_4_ * 3.0)
      ;
      local_4e0._8_4_ = auVar111._8_4_ + fVar62 * auVar71._8_4_ * 3.0;
      local_4e0._12_4_ = auVar111._12_4_ + fVar62 * auVar71._12_4_ * 3.0;
      auVar64 = vshufpd_avx(auVar111,auVar111,3);
      auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar277 = vsubps_avx(auVar64,auVar111);
      auVar99 = vsubps_avx(auVar63,(undefined1  [16])0x0);
      auVar103._0_4_ = auVar277._0_4_ + auVar99._0_4_;
      auVar103._4_4_ = auVar277._4_4_ + auVar99._4_4_;
      auVar103._8_4_ = auVar277._8_4_ + auVar99._8_4_;
      auVar103._12_4_ = auVar277._12_4_ + auVar99._12_4_;
      auVar277 = vshufps_avx(auVar111,auVar111,0xb1);
      auVar99 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar265._4_4_ = auVar103._0_4_;
      auVar265._0_4_ = auVar103._0_4_;
      auVar265._8_4_ = auVar103._0_4_;
      auVar265._12_4_ = auVar103._0_4_;
      auVar75 = vshufps_avx(auVar103,auVar103,0x55);
      fVar155 = auVar75._0_4_;
      auVar191._0_4_ = auVar277._0_4_ * fVar155;
      fVar156 = auVar75._4_4_;
      auVar191._4_4_ = auVar277._4_4_ * fVar156;
      fVar97 = auVar75._8_4_;
      auVar191._8_4_ = auVar277._8_4_ * fVar97;
      fVar98 = auVar75._12_4_;
      auVar191._12_4_ = auVar277._12_4_ * fVar98;
      auVar205._0_4_ = auVar99._0_4_ * fVar155;
      auVar205._4_4_ = auVar99._4_4_ * fVar156;
      auVar205._8_4_ = auVar99._8_4_ * fVar97;
      auVar205._12_4_ = auVar99._12_4_ * fVar98;
      auVar207 = vfmadd231ps_fma(auVar191,auVar265,auVar111);
      auVar76 = vfmadd231ps_fma(auVar205,auVar265,local_4e0._0_16_);
      auVar99 = vshufps_avx(auVar207,auVar207,0xe8);
      auVar75 = vshufps_avx(auVar76,auVar76,0xe8);
      auVar277 = vcmpps_avx(auVar99,auVar75,1);
      uVar51 = vextractps_avx(auVar277,0);
      auVar66 = auVar76;
      if ((uVar51 & 1) == 0) {
        auVar66 = auVar207;
      }
      auVar129._0_4_ = fVar62 * auVar71._16_4_ * 3.0;
      auVar129._4_4_ = fVar62 * fVar181;
      auVar129._8_4_ = fVar62 * auVar71._24_4_ * 3.0;
      auVar129._12_4_ = fVar62 * fVar154;
      auVar140 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar130 = vshufps_avx(auVar140,auVar140,0xb1);
      auVar74 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar283._0_4_ = auVar130._0_4_ * fVar155;
      auVar283._4_4_ = auVar130._4_4_ * fVar156;
      auVar283._8_4_ = auVar130._8_4_ * fVar97;
      auVar283._12_4_ = auVar130._12_4_ * fVar98;
      auVar104._0_4_ = auVar74._0_4_ * fVar155;
      auVar104._4_4_ = auVar74._4_4_ * fVar156;
      auVar104._8_4_ = auVar74._8_4_ * fVar97;
      auVar104._12_4_ = auVar74._12_4_ * fVar98;
      auVar141 = vfmadd231ps_fma(auVar283,auVar265,auVar140);
      auVar142 = vfmadd231ps_fma(auVar104,(undefined1  [16])0x0,auVar265);
      auVar74 = vshufps_avx(auVar141,auVar141,0xe8);
      auVar123 = vshufps_avx(auVar142,auVar142,0xe8);
      auVar130 = vcmpps_avx(auVar74,auVar123,1);
      uVar51 = vextractps_avx(auVar130,0);
      auVar187 = auVar142;
      if ((uVar51 & 1) == 0) {
        auVar187 = auVar141;
      }
      auVar66 = vmaxss_avx(auVar187,auVar66);
      auVar99 = vminps_avx(auVar99,auVar75);
      auVar75 = vminps_avx(auVar74,auVar123);
      auVar75 = vminps_avx(auVar99,auVar75);
      auVar277 = vshufps_avx(auVar277,auVar277,0x55);
      auVar277 = vblendps_avx(auVar277,auVar130,2);
      auVar130 = vpslld_avx(auVar277,0x1f);
      auVar277 = vshufpd_avx(auVar76,auVar76,1);
      auVar277 = vinsertps_avx(auVar277,auVar142,0x9c);
      auVar99 = vshufpd_avx(auVar207,auVar207,1);
      auVar99 = vinsertps_avx(auVar99,auVar141,0x9c);
      auVar277 = vblendvps_avx(auVar99,auVar277,auVar130);
      auVar99 = vmovshdup_avx(auVar277);
      auVar277 = vmaxss_avx(auVar99,auVar277);
      fVar97 = auVar75._0_4_;
      auVar99 = vmovshdup_avx(auVar75);
      fVar156 = auVar277._0_4_;
      fVar155 = auVar66._0_4_;
      if ((0.0001 <= fVar97) || (fVar156 <= -0.0001)) {
        auVar207 = vcmpps_avx(auVar99,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar76 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar207 = vorps_avx(auVar76,auVar207);
        if ((-0.0001 < fVar155 & auVar207[0]) != 0) goto LAB_016da9bc;
        auVar207 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar277,5);
        auVar76 = vcmpps_avx(auVar99,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar207 = vorps_avx(auVar76,auVar207);
        if ((auVar207 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016da9bc;
LAB_016db37a:
        bVar41 = true;
      }
      else {
LAB_016da9bc:
        auVar76 = vcmpps_avx(auVar75,_DAT_01feba10,1);
        auVar130 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar207 = vcmpss_avx(auVar66,ZEXT816(0) << 0x20,1);
        auVar148._8_4_ = 0x3f800000;
        auVar148._0_8_ = &DAT_3f8000003f800000;
        auVar148._12_4_ = 0x3f800000;
        auVar206._8_4_ = 0xbf800000;
        auVar206._0_8_ = 0xbf800000bf800000;
        auVar206._12_4_ = 0xbf800000;
        auVar207 = vblendvps_avx(auVar148,auVar206,auVar207);
        auVar76 = vblendvps_avx(auVar148,auVar206,auVar76);
        fVar98 = auVar76._0_4_;
        fVar62 = auVar207._0_4_;
        auVar207 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar98 == fVar62) && (!NAN(fVar98) && !NAN(fVar62))) {
          auVar207 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar74 = ZEXT816(0) << 0x20;
        if ((fVar98 == fVar62) && (!NAN(fVar98) && !NAN(fVar62))) {
          auVar130 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar76 = vmovshdup_avx(auVar76);
        fVar181 = auVar76._0_4_;
        if ((fVar98 != fVar181) || (NAN(fVar98) || NAN(fVar181))) {
          fVar98 = auVar99._0_4_;
          if ((fVar98 != fVar97) || (NAN(fVar98) || NAN(fVar97))) {
            auVar105._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
            auVar105._8_4_ = auVar75._8_4_ ^ 0x80000000;
            auVar105._12_4_ = auVar75._12_4_ ^ 0x80000000;
            auVar131._0_4_ = -fVar97 / (fVar98 - fVar97);
            auVar131._4_12_ = auVar105._4_12_;
            auVar99 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar74,auVar131);
            auVar75 = auVar99;
          }
          else {
            auVar99 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar97 == 0.0) && (auVar99 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar97))) {
              auVar99 = ZEXT816(0);
            }
            auVar75 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar97 == 0.0) && (auVar75 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar97))) {
              auVar75 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar207 = vminss_avx(auVar207,auVar99);
          auVar130 = vmaxss_avx(auVar75,auVar130);
        }
        auVar277 = vcmpss_avx(auVar277,auVar74,1);
        auVar132._8_4_ = 0x3f800000;
        auVar132._0_8_ = &DAT_3f8000003f800000;
        auVar132._12_4_ = 0x3f800000;
        auVar149._8_4_ = 0xbf800000;
        auVar149._0_8_ = 0xbf800000bf800000;
        auVar149._12_4_ = 0xbf800000;
        auVar277 = vblendvps_avx(auVar132,auVar149,auVar277);
        fVar97 = auVar277._0_4_;
        auVar277 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar62 != fVar97) || (NAN(fVar62) || NAN(fVar97))) {
          if ((fVar156 != fVar155) || (NAN(fVar156) || NAN(fVar155))) {
            auVar106._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
            auVar106._8_4_ = auVar66._8_4_ ^ 0x80000000;
            auVar106._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar133._0_4_ = -fVar155 / (fVar156 - fVar155);
            auVar133._4_12_ = auVar106._4_12_;
            auVar99 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar133._0_4_)),auVar74,auVar133);
            auVar75 = auVar99;
          }
          else {
            auVar99 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar155 == 0.0) && (auVar99 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar155))) {
              auVar99 = ZEXT816(0);
            }
            auVar75 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar155 == 0.0) && (auVar75 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar155))) {
              auVar75 = auVar277;
            }
          }
          auVar207 = vminss_avx(auVar207,auVar99);
          auVar130 = vmaxss_avx(auVar75,auVar130);
        }
        if ((fVar181 != fVar97) || (NAN(fVar181) || NAN(fVar97))) {
          auVar207 = vminss_avx(auVar207,auVar277);
          auVar130 = vmaxss_avx(auVar277,auVar130);
        }
        auVar99 = vmaxss_avx(auVar74,auVar207);
        auVar75 = vminss_avx(auVar130,auVar277);
        bVar41 = true;
        if (auVar99._0_4_ <= auVar75._0_4_) {
          auVar99 = vmaxss_avx(auVar74,ZEXT416((uint)(auVar99._0_4_ + -0.1)));
          auVar277 = vminss_avx(ZEXT416((uint)(auVar75._0_4_ + 0.1)),auVar277);
          auVar86._0_8_ = auVar111._0_8_;
          auVar86._8_8_ = auVar86._0_8_;
          auVar208._8_8_ = local_4e0._0_8_;
          auVar208._0_8_ = local_4e0._0_8_;
          auVar224._8_8_ = auVar140._0_8_;
          auVar224._0_8_ = auVar140._0_8_;
          auVar75 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
          auVar207 = vshufpd_avx(auVar140,auVar140,3);
          auVar76 = vshufps_avx(auVar99,auVar277,0);
          auVar114._8_4_ = 0x3f800000;
          auVar114._0_8_ = &DAT_3f8000003f800000;
          auVar114._12_4_ = 0x3f800000;
          auVar111 = vsubps_avx(auVar114,auVar76);
          local_6e0._0_4_ = auVar64._0_4_;
          local_6e0._4_4_ = auVar64._4_4_;
          fStack_6d8 = auVar64._8_4_;
          fStack_6d4 = auVar64._12_4_;
          fVar155 = auVar76._0_4_;
          auVar115._0_4_ = fVar155 * (float)local_6e0._0_4_;
          fVar156 = auVar76._4_4_;
          auVar115._4_4_ = fVar156 * (float)local_6e0._4_4_;
          fVar97 = auVar76._8_4_;
          auVar115._8_4_ = fVar97 * fStack_6d8;
          fVar98 = auVar76._12_4_;
          auVar115._12_4_ = fVar98 * fStack_6d4;
          auVar134._0_4_ = auVar75._0_4_ * fVar155;
          auVar134._4_4_ = auVar75._4_4_ * fVar156;
          auVar134._8_4_ = auVar75._8_4_ * fVar97;
          auVar134._12_4_ = auVar75._12_4_ * fVar98;
          auVar150._0_4_ = auVar207._0_4_ * fVar155;
          auVar150._4_4_ = auVar207._4_4_ * fVar156;
          auVar150._8_4_ = auVar207._8_4_ * fVar97;
          auVar150._12_4_ = auVar207._12_4_ * fVar98;
          local_6c0._0_4_ = auVar63._0_4_;
          local_6c0._4_4_ = auVar63._4_4_;
          uStack_6b8._0_4_ = auVar63._8_4_;
          uStack_6b8._4_4_ = auVar63._12_4_;
          auVar173._0_4_ = fVar155 * (float)local_6c0._0_4_;
          auVar173._4_4_ = fVar156 * (float)local_6c0._4_4_;
          auVar173._8_4_ = fVar97 * (float)uStack_6b8;
          auVar173._12_4_ = fVar98 * uStack_6b8._4_4_;
          auVar75 = vfmadd231ps_fma(auVar115,auVar111,auVar86);
          auVar207 = vfmadd231ps_fma(auVar134,auVar111,auVar208);
          auVar76 = vfmadd231ps_fma(auVar150,auVar111,auVar224);
          auVar111 = vfmadd231ps_fma(auVar173,auVar111,ZEXT816(0));
          auVar64 = vmovshdup_avx(local_760);
          auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar99._0_4_)),local_760,
                                    ZEXT416((uint)(1.0 - auVar99._0_4_)));
          auVar123 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar277._0_4_)),local_760,
                                     ZEXT416((uint)(1.0 - auVar277._0_4_)));
          fVar155 = 1.0 / fVar139;
          auVar277 = vsubps_avx(auVar207,auVar75);
          auVar192._0_4_ = auVar277._0_4_ * 3.0;
          auVar192._4_4_ = auVar277._4_4_ * 3.0;
          auVar192._8_4_ = auVar277._8_4_ * 3.0;
          auVar192._12_4_ = auVar277._12_4_ * 3.0;
          auVar277 = vsubps_avx(auVar76,auVar207);
          auVar209._0_4_ = auVar277._0_4_ * 3.0;
          auVar209._4_4_ = auVar277._4_4_ * 3.0;
          auVar209._8_4_ = auVar277._8_4_ * 3.0;
          auVar209._12_4_ = auVar277._12_4_ * 3.0;
          auVar277 = vsubps_avx(auVar111,auVar76);
          auVar225._0_4_ = auVar277._0_4_ * 3.0;
          auVar225._4_4_ = auVar277._4_4_ * 3.0;
          auVar225._8_4_ = auVar277._8_4_ * 3.0;
          auVar225._12_4_ = auVar277._12_4_ * 3.0;
          auVar64 = vminps_avx(auVar209,auVar225);
          auVar277 = vmaxps_avx(auVar209,auVar225);
          auVar64 = vminps_avx(auVar192,auVar64);
          auVar277 = vmaxps_avx(auVar192,auVar277);
          auVar63 = vshufpd_avx(auVar64,auVar64,3);
          auVar99 = vshufpd_avx(auVar277,auVar277,3);
          auVar64 = vminps_avx(auVar64,auVar63);
          auVar277 = vmaxps_avx(auVar277,auVar99);
          auVar210._0_4_ = auVar64._0_4_ * fVar155;
          auVar210._4_4_ = auVar64._4_4_ * fVar155;
          auVar210._8_4_ = auVar64._8_4_ * fVar155;
          auVar210._12_4_ = auVar64._12_4_ * fVar155;
          auVar193._0_4_ = fVar155 * auVar277._0_4_;
          auVar193._4_4_ = fVar155 * auVar277._4_4_;
          auVar193._8_4_ = fVar155 * auVar277._8_4_;
          auVar193._12_4_ = fVar155 * auVar277._12_4_;
          fVar155 = 1.0 / (auVar123._0_4_ - auVar74._0_4_);
          auVar277 = vshufpd_avx(auVar75,auVar75,3);
          auVar64 = vshufpd_avx(auVar207,auVar207,3);
          auVar63 = vshufpd_avx(auVar76,auVar76,3);
          auVar99 = vshufpd_avx(auVar111,auVar111,3);
          auVar277 = vsubps_avx(auVar277,auVar75);
          auVar75 = vsubps_avx(auVar64,auVar207);
          auVar207 = vsubps_avx(auVar63,auVar76);
          auVar99 = vsubps_avx(auVar99,auVar111);
          auVar64 = vminps_avx(auVar277,auVar75);
          auVar277 = vmaxps_avx(auVar277,auVar75);
          auVar63 = vminps_avx(auVar207,auVar99);
          auVar63 = vminps_avx(auVar64,auVar63);
          auVar64 = vmaxps_avx(auVar207,auVar99);
          auVar277 = vmaxps_avx(auVar277,auVar64);
          auVar242._0_4_ = fVar155 * auVar63._0_4_;
          auVar242._4_4_ = fVar155 * auVar63._4_4_;
          auVar242._8_4_ = fVar155 * auVar63._8_4_;
          auVar242._12_4_ = fVar155 * auVar63._12_4_;
          auVar232._0_4_ = fVar155 * auVar277._0_4_;
          auVar232._4_4_ = fVar155 * auVar277._4_4_;
          auVar232._8_4_ = fVar155 * auVar277._8_4_;
          auVar232._12_4_ = fVar155 * auVar277._12_4_;
          auVar99 = vinsertps_avx(auVar9,auVar74,0x10);
          auVar75 = vinsertps_avx(auVar10,auVar123,0x10);
          auVar69._0_4_ = (auVar99._0_4_ + auVar75._0_4_) * 0.5;
          auVar69._4_4_ = (auVar99._4_4_ + auVar75._4_4_) * 0.5;
          auVar69._8_4_ = (auVar99._8_4_ + auVar75._8_4_) * 0.5;
          auVar69._12_4_ = (auVar99._12_4_ + auVar75._12_4_) * 0.5;
          auVar116._4_4_ = auVar69._0_4_;
          auVar116._0_4_ = auVar69._0_4_;
          auVar116._8_4_ = auVar69._0_4_;
          auVar116._12_4_ = auVar69._0_4_;
          auVar277 = vfmadd213ps_fma(local_3b0,auVar116,auVar78);
          auVar64 = vfmadd213ps_fma(local_3c0,auVar116,auVar11);
          auVar63 = vfmadd213ps_fma(local_3d0,auVar116,auVar12);
          auVar10 = vsubps_avx(auVar64,auVar277);
          auVar277 = vfmadd213ps_fma(auVar10,auVar116,auVar277);
          auVar10 = vsubps_avx(auVar63,auVar64);
          auVar10 = vfmadd213ps_fma(auVar10,auVar116,auVar64);
          auVar10 = vsubps_avx(auVar10,auVar277);
          auVar277 = vfmadd231ps_fma(auVar277,auVar10,auVar116);
          auVar117._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
          auVar117._8_4_ = auVar10._8_4_ * 3.0;
          auVar117._12_4_ = auVar10._12_4_ * 3.0;
          auVar226._8_8_ = auVar277._0_8_;
          auVar226._0_8_ = auVar277._0_8_;
          auVar10 = vshufpd_avx(auVar277,auVar277,3);
          auVar277 = vshufps_avx(auVar69,auVar69,0x55);
          auVar207 = vsubps_avx(auVar10,auVar226);
          auVar111 = vfmadd231ps_fma(auVar226,auVar277,auVar207);
          auVar266._8_8_ = auVar117._0_8_;
          auVar266._0_8_ = auVar117._0_8_;
          auVar10 = vshufpd_avx(auVar117,auVar117,3);
          auVar10 = vsubps_avx(auVar10,auVar266);
          auVar76 = vfmadd213ps_fma(auVar10,auVar277,auVar266);
          auVar277 = vmovshdup_avx(auVar76);
          auVar267._0_8_ = auVar277._0_8_ ^ 0x8000000080000000;
          auVar267._8_4_ = auVar277._8_4_ ^ 0x80000000;
          auVar267._12_4_ = auVar277._12_4_ ^ 0x80000000;
          auVar64 = vmovshdup_avx(auVar207);
          auVar10 = vunpcklps_avx(auVar64,auVar267);
          auVar63 = vshufps_avx(auVar10,auVar267,4);
          auVar284._0_8_ = auVar207._0_8_ ^ 0x8000000080000000;
          auVar284._8_4_ = auVar207._8_4_ ^ 0x80000000;
          auVar284._12_4_ = auVar207._12_4_ ^ 0x80000000;
          auVar10 = vmovlhps_avx(auVar284,auVar76);
          auVar10 = vshufps_avx(auVar10,auVar76,8);
          auVar277 = vfmsub231ss_fma(ZEXT416((uint)(auVar277._0_4_ * auVar207._0_4_)),auVar64,
                                     auVar76);
          auVar135._0_4_ = auVar277._0_4_;
          auVar135._4_4_ = auVar135._0_4_;
          auVar135._8_4_ = auVar135._0_4_;
          auVar135._12_4_ = auVar135._0_4_;
          auVar277 = vdivps_avx(auVar63,auVar135);
          auVar64 = vdivps_avx(auVar10,auVar135);
          fVar97 = auVar111._0_4_;
          fVar155 = auVar277._0_4_;
          auVar10 = vshufps_avx(auVar111,auVar111,0x55);
          fVar156 = auVar64._0_4_;
          local_6c0._4_4_ = fVar97 * auVar277._4_4_ + auVar10._4_4_ * auVar64._4_4_;
          local_6c0._0_4_ = fVar97 * fVar155 + auVar10._0_4_ * fVar156;
          uStack_6b8._0_4_ = fVar97 * auVar277._8_4_ + auVar10._8_4_ * auVar64._8_4_;
          uStack_6b8._4_4_ = fVar97 * auVar277._12_4_ + auVar10._12_4_ * auVar64._12_4_;
          auVar207 = vmovshdup_avx(auVar277);
          auVar10 = vinsertps_avx(auVar210,auVar242,0x1c);
          auVar278._0_4_ = auVar207._0_4_ * auVar10._0_4_;
          auVar278._4_4_ = auVar207._4_4_ * auVar10._4_4_;
          auVar278._8_4_ = auVar207._8_4_ * auVar10._8_4_;
          auVar278._12_4_ = auVar207._12_4_ * auVar10._12_4_;
          auVar63 = vinsertps_avx(auVar193,auVar232,0x1c);
          auVar252._0_4_ = auVar207._0_4_ * auVar63._0_4_;
          auVar252._4_4_ = auVar207._4_4_ * auVar63._4_4_;
          auVar252._8_4_ = auVar207._8_4_ * auVar63._8_4_;
          auVar252._12_4_ = auVar207._12_4_ * auVar63._12_4_;
          auVar66 = vminps_avx(auVar278,auVar252);
          auVar111 = vmaxps_avx(auVar252,auVar278);
          auVar207 = vinsertps_avx(auVar242,auVar210,0x4c);
          auVar130 = vmovshdup_avx(auVar64);
          auVar76 = vinsertps_avx(auVar232,auVar193,0x4c);
          auVar233._0_4_ = auVar130._0_4_ * auVar207._0_4_;
          auVar233._4_4_ = auVar130._4_4_ * auVar207._4_4_;
          auVar233._8_4_ = auVar130._8_4_ * auVar207._8_4_;
          auVar233._12_4_ = auVar130._12_4_ * auVar207._12_4_;
          auVar243._0_4_ = auVar130._0_4_ * auVar76._0_4_;
          auVar243._4_4_ = auVar130._4_4_ * auVar76._4_4_;
          auVar243._8_4_ = auVar130._8_4_ * auVar76._8_4_;
          auVar243._12_4_ = auVar130._12_4_ * auVar76._12_4_;
          auVar130 = vminps_avx(auVar233,auVar243);
          auVar87._0_4_ = auVar130._0_4_ + auVar66._0_4_;
          auVar87._4_4_ = auVar130._4_4_ + auVar66._4_4_;
          auVar87._8_4_ = auVar130._8_4_ + auVar66._8_4_;
          auVar87._12_4_ = auVar130._12_4_ + auVar66._12_4_;
          auVar66 = vmaxps_avx(auVar243,auVar233);
          auVar234._0_4_ = auVar111._0_4_ + auVar66._0_4_;
          auVar234._4_4_ = auVar111._4_4_ + auVar66._4_4_;
          auVar234._8_4_ = auVar111._8_4_ + auVar66._8_4_;
          auVar234._12_4_ = auVar111._12_4_ + auVar66._12_4_;
          auVar244._8_8_ = 0x3f80000000000000;
          auVar244._0_8_ = 0x3f80000000000000;
          auVar111 = vsubps_avx(auVar244,auVar234);
          auVar66 = vsubps_avx(auVar244,auVar87);
          auVar130 = vsubps_avx(auVar99,auVar69);
          auVar268._0_4_ = fVar155 * auVar10._0_4_;
          auVar268._4_4_ = fVar155 * auVar10._4_4_;
          auVar268._8_4_ = fVar155 * auVar10._8_4_;
          auVar268._12_4_ = fVar155 * auVar10._12_4_;
          auVar253._0_4_ = fVar155 * auVar63._0_4_;
          auVar253._4_4_ = fVar155 * auVar63._4_4_;
          auVar253._8_4_ = fVar155 * auVar63._8_4_;
          auVar253._12_4_ = fVar155 * auVar63._12_4_;
          auVar63 = vminps_avx(auVar268,auVar253);
          auVar10 = vmaxps_avx(auVar253,auVar268);
          auVar211._0_4_ = fVar156 * auVar207._0_4_;
          auVar211._4_4_ = fVar156 * auVar207._4_4_;
          auVar211._8_4_ = fVar156 * auVar207._8_4_;
          auVar211._12_4_ = fVar156 * auVar207._12_4_;
          auVar194._0_4_ = fVar156 * auVar76._0_4_;
          auVar194._4_4_ = fVar156 * auVar76._4_4_;
          auVar194._8_4_ = fVar156 * auVar76._8_4_;
          auVar194._12_4_ = fVar156 * auVar76._12_4_;
          auVar207 = vminps_avx(auVar211,auVar194);
          auVar269._0_4_ = auVar63._0_4_ + auVar207._0_4_;
          auVar269._4_4_ = auVar63._4_4_ + auVar207._4_4_;
          auVar269._8_4_ = auVar63._8_4_ + auVar207._8_4_;
          auVar269._12_4_ = auVar63._12_4_ + auVar207._12_4_;
          auVar207 = vsubps_avx(auVar75,auVar69);
          auVar63 = vmaxps_avx(auVar194,auVar211);
          fVar97 = auVar130._0_4_;
          auVar212._0_4_ = fVar97 * auVar111._0_4_;
          fVar98 = auVar130._4_4_;
          auVar212._4_4_ = fVar98 * auVar111._4_4_;
          fVar62 = auVar130._8_4_;
          auVar212._8_4_ = fVar62 * auVar111._8_4_;
          fVar181 = auVar130._12_4_;
          auVar212._12_4_ = fVar181 * auVar111._12_4_;
          auVar195._0_4_ = auVar10._0_4_ + auVar63._0_4_;
          auVar195._4_4_ = auVar10._4_4_ + auVar63._4_4_;
          auVar195._8_4_ = auVar10._8_4_ + auVar63._8_4_;
          auVar195._12_4_ = auVar10._12_4_ + auVar63._12_4_;
          auVar254._8_8_ = 0x3f800000;
          auVar254._0_8_ = 0x3f800000;
          auVar10 = vsubps_avx(auVar254,auVar195);
          auVar63 = vsubps_avx(auVar254,auVar269);
          auVar270._0_4_ = fVar97 * auVar66._0_4_;
          auVar270._4_4_ = fVar98 * auVar66._4_4_;
          auVar270._8_4_ = fVar62 * auVar66._8_4_;
          auVar270._12_4_ = fVar181 * auVar66._12_4_;
          fVar157 = auVar207._0_4_;
          auVar235._0_4_ = fVar157 * auVar111._0_4_;
          fVar158 = auVar207._4_4_;
          auVar235._4_4_ = fVar158 * auVar111._4_4_;
          fVar159 = auVar207._8_4_;
          auVar235._8_4_ = fVar159 * auVar111._8_4_;
          fVar160 = auVar207._12_4_;
          auVar235._12_4_ = fVar160 * auVar111._12_4_;
          auVar88._0_4_ = fVar157 * auVar66._0_4_;
          auVar88._4_4_ = fVar158 * auVar66._4_4_;
          auVar88._8_4_ = fVar159 * auVar66._8_4_;
          auVar88._12_4_ = fVar160 * auVar66._12_4_;
          auVar285._0_4_ = fVar97 * auVar10._0_4_;
          auVar285._4_4_ = fVar98 * auVar10._4_4_;
          auVar285._8_4_ = fVar62 * auVar10._8_4_;
          auVar285._12_4_ = fVar181 * auVar10._12_4_;
          auVar245._0_4_ = fVar97 * auVar63._0_4_;
          auVar245._4_4_ = fVar98 * auVar63._4_4_;
          auVar245._8_4_ = fVar62 * auVar63._8_4_;
          auVar245._12_4_ = fVar181 * auVar63._12_4_;
          auVar196._0_4_ = fVar157 * auVar10._0_4_;
          auVar196._4_4_ = fVar158 * auVar10._4_4_;
          auVar196._8_4_ = fVar159 * auVar10._8_4_;
          auVar196._12_4_ = fVar160 * auVar10._12_4_;
          auVar255._0_4_ = fVar157 * auVar63._0_4_;
          auVar255._4_4_ = fVar158 * auVar63._4_4_;
          auVar255._8_4_ = fVar159 * auVar63._8_4_;
          auVar255._12_4_ = fVar160 * auVar63._12_4_;
          auVar10 = vminps_avx(auVar285,auVar245);
          auVar63 = vminps_avx(auVar196,auVar255);
          auVar10 = vminps_avx(auVar10,auVar63);
          auVar63 = vmaxps_avx(auVar245,auVar285);
          auVar207 = vminps_avx(auVar212,auVar270);
          auVar76 = vminps_avx(auVar235,auVar88);
          auVar207 = vminps_avx(auVar207,auVar76);
          auVar10 = vhaddps_avx(auVar10,auVar207);
          auVar207 = vmaxps_avx(auVar255,auVar196);
          auVar63 = vmaxps_avx(auVar207,auVar63);
          auVar207 = vmaxps_avx(auVar270,auVar212);
          auVar76 = vmaxps_avx(auVar88,auVar235);
          auVar207 = vmaxps_avx(auVar76,auVar207);
          auVar63 = vhaddps_avx(auVar63,auVar207);
          auVar207 = vshufps_avx(auVar69,auVar69,0x54);
          auVar207 = vsubps_avx(auVar207,_local_6c0);
          auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
          auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
          auVar213._0_4_ = auVar207._0_4_ + auVar10._0_4_;
          auVar213._4_4_ = auVar207._4_4_ + auVar10._4_4_;
          auVar213._8_4_ = auVar207._8_4_ + auVar10._8_4_;
          auVar213._12_4_ = auVar207._12_4_ + auVar10._12_4_;
          auVar197._0_4_ = auVar207._0_4_ + auVar63._0_4_;
          auVar197._4_4_ = auVar207._4_4_ + auVar63._4_4_;
          auVar197._8_4_ = auVar207._8_4_ + auVar63._8_4_;
          auVar197._12_4_ = auVar207._12_4_ + auVar63._12_4_;
          auVar10 = vmaxps_avx(auVar99,auVar213);
          auVar63 = vminps_avx(auVar197,auVar75);
          auVar10 = vcmpps_avx(auVar63,auVar10,1);
          auVar10 = vshufps_avx(auVar10,auVar10,0x50);
          local_760 = vinsertps_avx(auVar74,ZEXT416((uint)auVar123._0_4_),0x10);
          if ((auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar10[0xf] < '\0') goto LAB_016db37a;
          bVar56 = 0;
          if ((auVar179._0_4_ < auVar213._0_4_) && (bVar56 = 0, auVar197._0_4_ < auVar75._0_4_)) {
            auVar63 = vmovshdup_avx(auVar213);
            auVar10 = vcmpps_avx(auVar197,auVar75,1);
            bVar56 = auVar10[4] & auVar74._0_4_ < auVar63._0_4_;
          }
          if (((3 < (uint)uVar53 || fVar139 < 0.001) | bVar56) == 1) {
            lVar55 = 200;
            do {
              fVar62 = auVar207._0_4_;
              fVar98 = 1.0 - fVar62;
              fVar139 = fVar98 * fVar98 * fVar98;
              fVar97 = fVar62 * 3.0 * fVar98 * fVar98;
              fVar98 = fVar98 * fVar62 * fVar62 * 3.0;
              auVar151._4_4_ = fVar139;
              auVar151._0_4_ = fVar139;
              auVar151._8_4_ = fVar139;
              auVar151._12_4_ = fVar139;
              auVar107._4_4_ = fVar97;
              auVar107._0_4_ = fVar97;
              auVar107._8_4_ = fVar97;
              auVar107._12_4_ = fVar97;
              auVar89._4_4_ = fVar98;
              auVar89._0_4_ = fVar98;
              auVar89._8_4_ = fVar98;
              auVar89._12_4_ = fVar98;
              fVar62 = fVar62 * fVar62 * fVar62;
              auVar174._0_4_ = (float)local_580._0_4_ * fVar62;
              auVar174._4_4_ = (float)local_580._4_4_ * fVar62;
              auVar174._8_4_ = fStack_578 * fVar62;
              auVar174._12_4_ = fStack_574 * fVar62;
              auVar10 = vfmadd231ps_fma(auVar174,auVar12,auVar89);
              auVar10 = vfmadd231ps_fma(auVar10,auVar11,auVar107);
              auVar10 = vfmadd231ps_fma(auVar10,auVar78,auVar151);
              auVar90._8_8_ = auVar10._0_8_;
              auVar90._0_8_ = auVar10._0_8_;
              auVar10 = vshufpd_avx(auVar10,auVar10,3);
              auVar63 = vshufps_avx(auVar207,auVar207,0x55);
              auVar10 = vsubps_avx(auVar10,auVar90);
              auVar63 = vfmadd213ps_fma(auVar10,auVar63,auVar90);
              fVar139 = auVar63._0_4_;
              auVar10 = vshufps_avx(auVar63,auVar63,0x55);
              auVar91._0_4_ = fVar155 * fVar139 + fVar156 * auVar10._0_4_;
              auVar91._4_4_ = auVar277._4_4_ * fVar139 + auVar64._4_4_ * auVar10._4_4_;
              auVar91._8_4_ = auVar277._8_4_ * fVar139 + auVar64._8_4_ * auVar10._8_4_;
              auVar91._12_4_ = auVar277._12_4_ * fVar139 + auVar64._12_4_ * auVar10._12_4_;
              auVar207 = vsubps_avx(auVar207,auVar91);
              auVar10 = vandps_avx(auVar282,auVar63);
              auVar63 = vshufps_avx(auVar10,auVar10,0xf5);
              auVar10 = vmaxss_avx(auVar63,auVar10);
              if (auVar10._0_4_ < (float)local_3e0._0_4_) {
                local_120 = auVar207._0_4_;
                if ((0.0 <= local_120) && (local_120 <= 1.0)) {
                  auVar10 = vmovshdup_avx(auVar207);
                  fVar139 = auVar10._0_4_;
                  if ((0.0 <= fVar139) && (fVar139 <= 1.0)) {
                    auVar277 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                             ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                             0x1c);
                    auVar66 = vinsertps_avx(auVar277,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar277 = vdpps_avx(auVar66,local_590,0x7f);
                    auVar64 = vdpps_avx(auVar66,local_5a0,0x7f);
                    auVar63 = vdpps_avx(auVar66,local_3f0,0x7f);
                    auVar99 = vdpps_avx(auVar66,local_400,0x7f);
                    auVar75 = vdpps_avx(auVar66,local_410,0x7f);
                    auVar76 = vdpps_avx(auVar66,local_420,0x7f);
                    auVar111 = vdpps_avx(auVar66,local_430,0x7f);
                    auVar66 = vdpps_avx(auVar66,local_440,0x7f);
                    fVar155 = 1.0 - fVar139;
                    auVar277 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * auVar75._0_4_)),
                                               ZEXT416((uint)fVar155),auVar277);
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar139)),
                                              ZEXT416((uint)fVar155),auVar64);
                    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar111._0_4_ * fVar139)),
                                              ZEXT416((uint)fVar155),auVar63);
                    auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * auVar66._0_4_)),
                                              ZEXT416((uint)fVar155),auVar99);
                    fVar98 = 1.0 - local_120;
                    fVar155 = fVar98 * local_120 * local_120 * 3.0;
                    fVar181 = local_120 * local_120 * local_120;
                    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * auVar99._0_4_)),
                                              ZEXT416((uint)fVar155),auVar63);
                    fVar156 = local_120 * 3.0 * fVar98 * fVar98;
                    auVar64 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar156),auVar64);
                    fVar97 = fVar98 * fVar98 * fVar98;
                    auVar277 = vfmadd231ss_fma(auVar64,ZEXT416((uint)fVar97),auVar277);
                    auVar71 = ZEXT1632(auVar277);
                    fVar62 = auVar277._0_4_;
                    if (((fVar60 <= fVar62) &&
                        (fVar157 = *(float *)(ray + k * 4 + 0x100), fVar62 <= fVar157)) &&
                       (pGVar5 = (context->scene->geometries).items[uVar49].ptr,
                       (pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                      auVar64 = vshufps_avx(auVar207,auVar207,0x55);
                      auVar227._8_4_ = 0x3f800000;
                      auVar227._0_8_ = &DAT_3f8000003f800000;
                      auVar227._12_4_ = 0x3f800000;
                      auVar63 = vsubps_avx(auVar227,auVar64);
                      fVar158 = auVar64._0_4_;
                      auVar236._0_4_ = fVar158 * (float)local_5c0._0_4_;
                      fVar159 = auVar64._4_4_;
                      auVar236._4_4_ = fVar159 * (float)local_5c0._4_4_;
                      fVar160 = auVar64._8_4_;
                      auVar236._8_4_ = fVar160 * fStack_5b8;
                      fVar180 = auVar64._12_4_;
                      auVar236._12_4_ = fVar180 * fStack_5b4;
                      auVar246._0_4_ = fVar158 * (float)local_610._0_4_;
                      auVar246._4_4_ = fVar159 * (float)local_610._4_4_;
                      auVar246._8_4_ = fVar160 * fStack_608;
                      auVar246._12_4_ = fVar180 * fStack_604;
                      auVar256._0_4_ = fVar158 * (float)local_620._0_4_;
                      auVar256._4_4_ = fVar159 * (float)local_620._4_4_;
                      auVar256._8_4_ = fVar160 * fStack_618;
                      auVar256._12_4_ = fVar180 * fStack_614;
                      auVar214._0_4_ = fVar158 * (float)local_5e0._0_4_;
                      auVar214._4_4_ = fVar159 * (float)local_5e0._4_4_;
                      auVar214._8_4_ = fVar160 * fStack_5d8;
                      auVar214._12_4_ = fVar180 * fStack_5d4;
                      auVar64 = vfmadd231ps_fma(auVar236,auVar63,local_5b0);
                      auVar99 = vfmadd231ps_fma(auVar246,auVar63,local_5f0);
                      auVar75 = vfmadd231ps_fma(auVar256,auVar63,local_600);
                      auVar207 = vfmadd231ps_fma(auVar214,auVar63,local_5d0);
                      auVar64 = vsubps_avx(auVar99,auVar64);
                      auVar63 = vsubps_avx(auVar75,auVar99);
                      auVar99 = vsubps_avx(auVar207,auVar75);
                      auVar257._0_4_ = local_120 * auVar63._0_4_;
                      auVar257._4_4_ = local_120 * auVar63._4_4_;
                      auVar257._8_4_ = local_120 * auVar63._8_4_;
                      auVar257._12_4_ = local_120 * auVar63._12_4_;
                      auVar198._4_4_ = fVar98;
                      auVar198._0_4_ = fVar98;
                      auVar198._8_4_ = fVar98;
                      auVar198._12_4_ = fVar98;
                      auVar64 = vfmadd231ps_fma(auVar257,auVar198,auVar64);
                      auVar215._0_4_ = local_120 * auVar99._0_4_;
                      auVar215._4_4_ = local_120 * auVar99._4_4_;
                      auVar215._8_4_ = local_120 * auVar99._8_4_;
                      auVar215._12_4_ = local_120 * auVar99._12_4_;
                      auVar63 = vfmadd231ps_fma(auVar215,auVar198,auVar63);
                      auVar216._0_4_ = local_120 * auVar63._0_4_;
                      auVar216._4_4_ = local_120 * auVar63._4_4_;
                      auVar216._8_4_ = local_120 * auVar63._8_4_;
                      auVar216._12_4_ = local_120 * auVar63._12_4_;
                      auVar63 = vfmadd231ps_fma(auVar216,auVar198,auVar64);
                      auVar175._0_4_ = fVar181 * (float)local_490._0_4_;
                      auVar175._4_4_ = fVar181 * (float)local_490._4_4_;
                      auVar175._8_4_ = fVar181 * fStack_488;
                      auVar175._12_4_ = fVar181 * fStack_484;
                      auVar118._4_4_ = fVar155;
                      auVar118._0_4_ = fVar155;
                      auVar118._8_4_ = fVar155;
                      auVar118._12_4_ = fVar155;
                      auVar64 = vfmadd132ps_fma(auVar118,auVar175,local_480);
                      auVar152._4_4_ = fVar156;
                      auVar152._0_4_ = fVar156;
                      auVar152._8_4_ = fVar156;
                      auVar152._12_4_ = fVar156;
                      auVar64 = vfmadd132ps_fma(auVar152,auVar64,local_470);
                      auVar176._0_4_ = auVar63._0_4_ * 3.0;
                      auVar176._4_4_ = auVar63._4_4_ * 3.0;
                      auVar176._8_4_ = auVar63._8_4_ * 3.0;
                      auVar176._12_4_ = auVar63._12_4_ * 3.0;
                      auVar136._4_4_ = fVar97;
                      auVar136._0_4_ = fVar97;
                      auVar136._8_4_ = fVar97;
                      auVar136._12_4_ = fVar97;
                      auVar63 = vfmadd132ps_fma(auVar136,auVar64,local_460);
                      auVar64 = vshufps_avx(auVar176,auVar176,0xc9);
                      auVar119._0_4_ = auVar63._0_4_ * auVar64._0_4_;
                      auVar119._4_4_ = auVar63._4_4_ * auVar64._4_4_;
                      auVar119._8_4_ = auVar63._8_4_ * auVar64._8_4_;
                      auVar119._12_4_ = auVar63._12_4_ * auVar64._12_4_;
                      auVar64 = vshufps_avx(auVar63,auVar63,0xc9);
                      auVar64 = vfmsub231ps_fma(auVar119,auVar176,auVar64);
                      local_140 = auVar64._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar62;
                        uVar61 = vextractps_avx(auVar64,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar61;
                        uVar61 = vextractps_avx(auVar64,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar61;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                        *(float *)(ray + k * 4 + 0x1e0) = local_120;
                        *(float *)(ray + k * 4 + 0x200) = fVar139;
                        *(uint *)(ray + k * 4 + 0x220) = uVar4;
                        *(uint *)(ray + k * 4 + 0x240) = uVar49;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        local_100._0_8_ = auVar10._0_8_;
                        local_100._8_8_ = local_100._0_8_;
                        local_100._16_8_ = local_100._0_8_;
                        local_100._24_8_ = local_100._0_8_;
                        auVar10 = vmovshdup_avx(auVar64);
                        local_180 = auVar10._0_8_;
                        auVar10 = vshufps_avx(auVar64,auVar64,0xaa);
                        local_160 = auVar10._0_8_;
                        uStack_178 = local_180;
                        uStack_170 = local_180;
                        uStack_168 = local_180;
                        uStack_158 = local_160;
                        uStack_150 = local_160;
                        uStack_148 = local_160;
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = CONCAT44(uStack_33c,local_340);
                        uStack_d8 = CONCAT44(uStack_334,uStack_338);
                        uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                        uStack_c8 = CONCAT44(uStack_324,uStack_328);
                        local_c0 = CONCAT44(uStack_31c,local_320);
                        uStack_b8 = CONCAT44(uStack_314,uStack_318);
                        uStack_b0 = CONCAT44(uStack_30c,uStack_310);
                        uStack_a8 = CONCAT44(uStack_304,uStack_308);
                        auVar14 = vpcmpeqd_avx2(local_100,local_100);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = fVar62;
                        local_4c0 = local_360._0_8_;
                        uStack_4b8 = local_360._8_8_;
                        uStack_4b0 = local_360._16_8_;
                        uStack_4a8 = local_360._24_8_;
                        local_650.valid = (int *)&local_4c0;
                        local_650.geometryUserPtr = pGVar5->userPtr;
                        local_650.context = context->user;
                        local_650.hit = (RTCHitN *)&local_180;
                        local_650.N = 8;
                        local_650.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar71 = ZEXT1632(auVar277);
                          (*pGVar5->intersectionFilterN)(&local_650);
                          auVar95._8_56_ = extraout_var;
                          auVar95._0_8_ = extraout_XMM1_Qa;
                          auVar14 = vpcmpeqd_avx2(auVar95._0_32_,auVar95._0_32_);
                        }
                        auVar44._8_8_ = uStack_4b8;
                        auVar44._0_8_ = local_4c0;
                        auVar44._16_8_ = uStack_4b0;
                        auVar44._24_8_ = uStack_4a8;
                        auVar73 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar44);
                        auVar72 = auVar14 & ~auVar73;
                        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar72 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar72 >> 0x7f,0) == '\0') &&
                              (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar72 >> 0xbf,0) == '\0') &&
                            (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar72[0x1f]) {
                          auVar73 = auVar73 ^ auVar14;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar71 = ZEXT1632(auVar71._0_16_);
                            (*p_Var6)(&local_650);
                          }
                          auVar45._8_8_ = uStack_4b8;
                          auVar45._0_8_ = local_4c0;
                          auVar45._16_8_ = uStack_4b0;
                          auVar45._24_8_ = uStack_4a8;
                          auVar14 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar45
                                                 );
                          auVar72 = vpcmpeqd_avx2(auVar71,auVar71);
                          auVar73 = auVar14 ^ auVar72;
                          auVar71 = auVar72 & ~auVar14;
                          if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar71 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar71 >> 0x7f,0) != '\0') ||
                                (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar71 >> 0xbf,0) != '\0') ||
                              (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar71[0x1f] < '\0') {
                            auVar94._0_4_ = auVar14._0_4_ ^ auVar72._0_4_;
                            auVar94._4_4_ = auVar14._4_4_ ^ auVar72._4_4_;
                            auVar94._8_4_ = auVar14._8_4_ ^ auVar72._8_4_;
                            auVar94._12_4_ = auVar14._12_4_ ^ auVar72._12_4_;
                            auVar94._16_4_ = auVar14._16_4_ ^ auVar72._16_4_;
                            auVar94._20_4_ = auVar14._20_4_ ^ auVar72._20_4_;
                            auVar94._24_4_ = auVar14._24_4_ ^ auVar72._24_4_;
                            auVar94._28_4_ = auVar14._28_4_ ^ auVar72._28_4_;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])local_650.hit);
                            *(undefined1 (*) [32])(local_650.ray + 0x180) = auVar71;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x20));
                            *(undefined1 (*) [32])(local_650.ray + 0x1a0) = auVar71;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x40));
                            *(undefined1 (*) [32])(local_650.ray + 0x1c0) = auVar71;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x60));
                            *(undefined1 (*) [32])(local_650.ray + 0x1e0) = auVar71;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x80));
                            *(undefined1 (*) [32])(local_650.ray + 0x200) = auVar71;
                            auVar71 = vpmaskmovd_avx2(auVar94,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xa0));
                            *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar71;
                            auVar71 = vpmaskmovd_avx2(auVar94,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xc0));
                            *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar71;
                            auVar71 = vpmaskmovd_avx2(auVar94,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xe0));
                            *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar71;
                            auVar71 = vpmaskmovd_avx2(auVar94,*(undefined1 (*) [32])
                                                               (local_650.hit + 0x100));
                            *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar71;
                          }
                        }
                        if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar73 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar73 >> 0x7f,0) == '\0') &&
                              (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar73 >> 0xbf,0) == '\0') &&
                            (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar73[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar157;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar55 = lVar55 + -1;
            } while (lVar55 != 0);
          }
          else {
            bVar41 = false;
          }
        }
      }
    } while (bVar41);
    local_450 = vinsertps_avx(auVar9,ZEXT416((uint)fVar154),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }